

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O1

string * __thiscall
KMeans::genModelEvaluationFunction_abi_cxx11_(string *__return_storage_ptr__,KMeans *this)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long lVar4;
  string *psVar5;
  long *plVar6;
  Attribute *pAVar7;
  undefined8 *puVar8;
  mapped_type *pmVar9;
  long *plVar10;
  ulong *puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_type *psVar13;
  ulong uVar14;
  size_t attID;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  ulong uVar17;
  char cVar18;
  ushort uVar19;
  byte bVar29;
  char cVar30;
  byte bVar31;
  char cVar32;
  byte bVar33;
  char cVar34;
  byte bVar35;
  char cVar36;
  byte bVar37;
  undefined1 auVar27 [16];
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  string __str_1;
  string numCategVar;
  string precompMeanSum;
  string evalFunction;
  string distance;
  string testTuple;
  string loadFunction;
  string valueToMeanMap;
  string attrConstruct;
  string attributeString;
  string local_e38;
  ulong *local_e18;
  long local_e10;
  ulong local_e08;
  long lStack_e00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_df8;
  long local_df0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_de8;
  string local_dd8;
  long *local_db8;
  long local_db0;
  long local_da8;
  long lStack_da0;
  ulong *local_d98;
  long local_d90;
  ulong local_d88;
  long lStack_d80;
  ulong *local_d78;
  long local_d70;
  ulong local_d68;
  long lStack_d60;
  ulong *local_d58;
  long local_d50;
  ulong local_d48;
  undefined8 uStack_d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d38;
  ulong *local_d18;
  long local_d10;
  ulong local_d08;
  long lStack_d00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  ulong *local_c98;
  long local_c90;
  ulong local_c88;
  undefined8 uStack_c80;
  ulong *local_c78;
  long local_c70;
  ulong local_c68;
  undefined8 uStack_c60;
  ulong *local_c58;
  long local_c50;
  ulong local_c48;
  long lStack_c40;
  ulong *local_c38;
  long local_c30;
  ulong local_c28;
  long lStack_c20;
  ulong *local_c18;
  long local_c10;
  ulong local_c08;
  long lStack_c00;
  ulong *local_bf8;
  long local_bf0;
  ulong local_be8;
  long lStack_be0;
  undefined8 *local_bd8;
  undefined8 local_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  ulong *local_bb8;
  long local_bb0;
  ulong local_ba8;
  long lStack_ba0;
  ulong *local_b98;
  long local_b90;
  ulong local_b88;
  long lStack_b80;
  ulong *local_b78;
  long local_b70;
  ulong local_b68;
  undefined8 uStack_b60;
  ulong *local_b58;
  long local_b50;
  ulong local_b48;
  long lStack_b40;
  ulong *local_b38;
  long local_b30;
  ulong local_b28;
  long lStack_b20;
  ulong *local_b18;
  long local_b10;
  ulong local_b08;
  undefined8 uStack_b00;
  string local_af8;
  ulong *local_ad8;
  long local_ad0;
  ulong local_ac8;
  long lStack_ac0;
  ulong *local_ab8;
  long local_ab0;
  ulong local_aa8;
  long lStack_aa0;
  ulong *local_a98;
  long local_a90;
  ulong local_a88;
  undefined8 uStack_a80;
  ulong *local_a78;
  long local_a70;
  ulong local_a68;
  undefined8 uStack_a60;
  ulong *local_a58;
  long local_a50;
  ulong local_a48;
  undefined8 uStack_a40;
  ulong *local_a38;
  long local_a30;
  ulong local_a28;
  undefined8 uStack_a20;
  ulong *local_a18;
  long local_a10;
  ulong local_a08;
  long lStack_a00;
  ulong *local_9f8;
  long local_9f0;
  ulong local_9e8;
  long lStack_9e0;
  ulong *local_9d8;
  long local_9d0;
  ulong local_9c8;
  long lStack_9c0;
  ulong *local_9b8;
  long local_9b0;
  ulong local_9a8;
  undefined8 uStack_9a0;
  long *local_998;
  long local_990;
  long local_988;
  long lStack_980;
  ulong *local_978;
  long local_970;
  ulong local_968;
  long lStack_960;
  ulong *local_958;
  long local_950;
  ulong local_948;
  long lStack_940;
  ulong *local_938;
  long local_930;
  ulong local_928;
  long lStack_920;
  ulong *local_918;
  long local_910;
  ulong local_908;
  long lStack_900;
  ulong *local_8f8;
  long local_8f0;
  ulong local_8e8;
  long lStack_8e0;
  long *local_8d8;
  long local_8d0;
  long local_8c8;
  long lStack_8c0;
  ulong *local_8b8;
  long local_8b0;
  ulong local_8a8;
  long lStack_8a0;
  ulong *local_898;
  long local_890;
  ulong local_888;
  long lStack_880;
  ulong *local_878;
  long local_870;
  ulong local_868;
  long lStack_860;
  ulong *local_858;
  long local_850;
  ulong local_848;
  long lStack_840;
  ulong *local_838;
  long local_830;
  ulong local_828;
  long lStack_820;
  ulong *local_818;
  long local_810;
  ulong local_808;
  long lStack_800;
  ulong *local_7f8;
  long local_7f0;
  ulong local_7e8;
  long lStack_7e0;
  ulong *local_7d8;
  long local_7d0;
  ulong local_7c8;
  long lStack_7c0;
  ulong *local_7b8;
  long local_7b0;
  ulong local_7a8;
  long lStack_7a0;
  ulong *local_798;
  long local_790;
  ulong local_788;
  long lStack_780;
  ulong *local_778;
  long local_770;
  ulong local_768;
  long lStack_760;
  ulong *local_758;
  long local_750;
  ulong local_748;
  long lStack_740;
  ulong *local_738;
  long local_730;
  ulong local_728;
  long lStack_720;
  ulong *local_718;
  long local_710;
  ulong local_708;
  long lStack_700;
  ulong *local_6f8;
  long local_6f0;
  ulong local_6e8;
  long lStack_6e0;
  ulong *local_6d8;
  long local_6d0;
  ulong local_6c8;
  long lStack_6c0;
  ulong *local_6b8;
  long local_6b0;
  ulong local_6a8 [2];
  ulong *local_698;
  long local_690;
  ulong local_688 [2];
  ulong *local_678;
  long local_670;
  ulong local_668 [2];
  ulong *local_658;
  long local_650;
  ulong local_648 [2];
  ulong *local_638;
  long local_630;
  ulong local_628 [2];
  ulong *local_618;
  long local_610;
  ulong local_608 [2];
  ulong *local_5f8;
  long local_5f0;
  ulong local_5e8 [2];
  ulong *local_5d8;
  long local_5d0;
  ulong local_5c8 [2];
  ulong *local_5b8;
  long local_5b0;
  ulong local_5a8 [2];
  ulong *local_598;
  long local_590;
  ulong local_588 [2];
  ulong *local_578;
  long local_570;
  ulong local_568 [2];
  ulong *local_558;
  long local_550;
  ulong local_548 [2];
  ulong *local_538;
  long local_530;
  ulong local_528 [2];
  ulong *local_518;
  long local_510;
  ulong local_508 [2];
  ulong *local_4f8;
  long local_4f0;
  ulong local_4e8 [2];
  ulong *local_4d8;
  long local_4d0;
  ulong local_4c8 [2];
  ulong *local_4b8;
  long local_4b0;
  ulong local_4a8 [2];
  ulong *local_498;
  long local_490;
  ulong local_488 [2];
  ulong *local_478;
  long local_470;
  ulong local_468 [2];
  ulong *local_458;
  long local_450;
  ulong local_448 [2];
  ulong *local_438;
  long local_430;
  ulong local_428 [2];
  ulong *local_418;
  long local_410;
  ulong local_408 [2];
  ulong *local_3f8;
  long local_3f0;
  ulong local_3e8 [2];
  ulong *local_3d8;
  long local_3d0;
  ulong local_3c8 [2];
  ulong *local_3b8;
  long local_3b0;
  ulong local_3a8 [2];
  undefined8 *local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  ulong *local_198;
  long local_190;
  ulong local_188 [2];
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  string *local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  undefined4 uVar20;
  undefined6 uVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
  local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_cd8,'\f');
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_cd8);
  local_8d8 = &local_8c8;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_8c8 = *plVar10;
    lStack_8c0 = plVar6[3];
  }
  else {
    local_8c8 = *plVar10;
    local_8d8 = (long *)*plVar6;
  }
  local_8d0 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_d8 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p);
  }
  if (this->numberOfOriginalVariables != 0) {
    paVar2 = &local_cb8.field_2;
    attID = 0;
    do {
      pAVar7 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          attID);
      local_db8 = &local_da8;
      std::__cxx11::string::_M_construct((ulong)&local_db8,'\x0f');
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_db8,0,(char *)0x0,0x2b2de1);
      local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
      puVar11 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_dd8.field_2._M_allocated_capacity = *puVar11;
        local_dd8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_dd8.field_2._M_allocated_capacity = *puVar11;
        local_dd8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_dd8._M_string_length = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_dd8);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar12) {
        local_de8._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_de8._8_8_ = plVar6[3];
        local_df8 = &local_de8;
      }
      else {
        local_de8._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_df8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6;
      }
      local_df0 = plVar6[1];
      *plVar6 = (long)paVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      Application::typeToStr_abi_cxx11_(&local_e38,&this->super_Application,pAVar7->_type);
      uVar15 = 0xf;
      if (local_df8 != &local_de8) {
        uVar15 = local_de8._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_e38._M_string_length + local_df0) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
          uVar15 = local_e38.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_e38._M_string_length + local_df0) goto LAB_001d7a5a;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_e38,0,(char *)0x0,(ulong)local_df8);
      }
      else {
LAB_001d7a5a:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_df8,(ulong)local_e38._M_dataplus._M_p);
      }
      local_c78 = &local_c68;
      puVar11 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar11) {
        local_c68 = *puVar11;
        uStack_c60 = puVar8[3];
      }
      else {
        local_c68 = *puVar11;
        local_c78 = (ulong *)*puVar8;
      }
      local_c70 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)puVar11 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_c78);
      puVar11 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar11) {
        local_d08 = *puVar11;
        lStack_d00 = plVar6[3];
        local_d18 = &local_d08;
      }
      else {
        local_d08 = *puVar11;
        local_d18 = (ulong *)*plVar6;
      }
      local_d10 = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d18,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      psVar13 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_cb8.field_2._M_allocated_capacity = *psVar13;
        local_cb8.field_2._8_8_ = plVar6[3];
        local_cb8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_cb8.field_2._M_allocated_capacity = *psVar13;
        local_cb8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_cb8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_cb8);
      local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
      psVar13 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_cd8.field_2._M_allocated_capacity = *psVar13;
        local_cd8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_cd8.field_2._M_allocated_capacity = *psVar13;
        local_cd8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_cd8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_8d8,(ulong)local_cd8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
        operator_delete(local_cd8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cb8._M_dataplus._M_p != paVar2) {
        operator_delete(local_cb8._M_dataplus._M_p);
      }
      if (local_d18 != &local_d08) {
        operator_delete(local_d18);
      }
      if (local_c78 != &local_c68) {
        operator_delete(local_c78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
        operator_delete(local_e38._M_dataplus._M_p);
      }
      if (local_df8 != &local_de8) {
        operator_delete(local_df8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
        operator_delete(local_dd8._M_dataplus._M_p);
      }
      if (local_db8 != &local_da8) {
        operator_delete(local_db8);
      }
      local_df8 = &local_de8;
      std::__cxx11::string::_M_construct((ulong)&local_df8,'\x06');
      Application::typeToStr_abi_cxx11_(&local_dd8,&this->super_Application,pAVar7->_type);
      uVar15 = 0xf;
      if (local_df8 != &local_de8) {
        uVar15 = local_de8._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_dd8._M_string_length + local_df0) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
          uVar15 = local_dd8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_dd8._M_string_length + local_df0) goto LAB_001d7d44;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_dd8,0,(char *)0x0,(ulong)local_df8);
      }
      else {
LAB_001d7d44:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_df8,(ulong)local_dd8._M_dataplus._M_p);
      }
      local_c78 = &local_c68;
      puVar11 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar11) {
        local_c68 = *puVar11;
        uStack_c60 = puVar8[3];
      }
      else {
        local_c68 = *puVar11;
        local_c78 = (ulong *)*puVar8;
      }
      local_c70 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)puVar11 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_c78);
      puVar11 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar11) {
        local_d08 = *puVar11;
        lStack_d00 = plVar6[3];
        local_d18 = &local_d08;
      }
      else {
        local_d08 = *puVar11;
        local_d18 = (ulong *)*plVar6;
      }
      local_d10 = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d18,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      psVar13 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_cb8.field_2._M_allocated_capacity = *psVar13;
        local_cb8.field_2._8_8_ = plVar6[3];
        local_cb8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_cb8.field_2._M_allocated_capacity = *psVar13;
        local_cb8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_cb8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_cb8);
      psVar13 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_cd8.field_2._M_allocated_capacity = *psVar13;
        local_cd8.field_2._8_8_ = plVar6[3];
        local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
      }
      else {
        local_cd8.field_2._M_allocated_capacity = *psVar13;
        local_cd8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_cd8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_cd8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
        operator_delete(local_cd8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cb8._M_dataplus._M_p != paVar2) {
        operator_delete(local_cb8._M_dataplus._M_p);
      }
      if (local_d18 != &local_d08) {
        operator_delete(local_d18);
      }
      if (local_c78 != &local_c68) {
        operator_delete(local_c78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
        operator_delete(local_dd8._M_dataplus._M_p);
      }
      if (local_df8 != &local_de8) {
        operator_delete(local_df8);
      }
      attID = attID + 1;
    } while (attID < this->numberOfOriginalVariables);
  }
  paVar12 = &local_cd8.field_2;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  local_d18 = &local_d08;
  std::__cxx11::string::_M_construct((ulong)&local_d18,'\x0f');
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_d18,0,(char *)0x0,0x2a6240);
  paVar2 = &local_cb8.field_2;
  psVar13 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_cb8.field_2._M_allocated_capacity = *psVar13;
    local_cb8.field_2._8_8_ = plVar6[3];
    local_cb8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_cb8.field_2._M_allocated_capacity = *psVar13;
    local_cb8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_cb8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_cb8);
  psVar13 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_cd8.field_2._M_allocated_capacity = *psVar13;
    local_cd8.field_2._8_8_ = plVar6[3];
    local_cd8._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_cd8.field_2._M_allocated_capacity = *psVar13;
    local_cd8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_cd8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_8d8,(ulong)local_cd8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != paVar12) {
    operator_delete(local_cd8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != paVar2) {
    operator_delete(local_cb8._M_dataplus._M_p);
  }
  if (local_d18 != &local_d08) {
    operator_delete(local_d18);
  }
  local_c38 = &local_c28;
  std::__cxx11::string::_M_construct((ulong)&local_c38,'\x03');
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c38);
  local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_cf8.field_2._M_allocated_capacity = *puVar11;
    local_cf8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_cf8.field_2._M_allocated_capacity = *puVar11;
    local_cf8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_cf8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_c18 = &local_c08;
  std::__cxx11::string::_M_construct((ulong)&local_c18,'\x03');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    uVar15 = local_cf8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_c10 + local_cf8._M_string_length) {
    uVar17 = 0xf;
    if (local_c18 != &local_c08) {
      uVar17 = local_c08;
    }
    if (uVar17 < local_c10 + local_cf8._M_string_length) goto LAB_001d81fe;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_c18,0,(char *)0x0,(ulong)local_cf8._M_dataplus._M_p);
  }
  else {
LAB_001d81fe:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_cf8,(ulong)local_c18);
  }
  local_d58 = &local_d48;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_d48 = *puVar11;
    uStack_d40 = puVar8[3];
  }
  else {
    local_d48 = *puVar11;
    local_d58 = (ulong *)*puVar8;
  }
  local_d50 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d58);
  local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
  psVar13 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_d38.field_2._M_allocated_capacity = *psVar13;
    local_d38.field_2._8_8_ = plVar6[3];
  }
  else {
    local_d38.field_2._M_allocated_capacity = *psVar13;
    local_d38._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_d38._M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_d38,(ulong)local_1b8[0]);
  local_d98 = &local_d88;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_d88 = *puVar11;
    lStack_d80 = plVar6[3];
  }
  else {
    local_d88 = *puVar11;
    local_d98 = (ulong *)*plVar6;
  }
  local_d90 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_c98 = &local_c88;
  std::__cxx11::string::_M_construct((ulong)&local_c98,'\x06');
  uVar17 = 0xf;
  if (local_d98 != &local_d88) {
    uVar17 = local_d88;
  }
  if (uVar17 < (ulong)(local_c90 + local_d90)) {
    uVar17 = 0xf;
    if (local_c98 != &local_c88) {
      uVar17 = local_c88;
    }
    if (uVar17 < (ulong)(local_c90 + local_d90)) goto LAB_001d83c9;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c98,0,(char *)0x0,(ulong)local_d98);
  }
  else {
LAB_001d83c9:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d98,(ulong)local_c98);
  }
  local_d78 = &local_d68;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_d68 = *puVar11;
    lStack_d60 = puVar8[3];
  }
  else {
    local_d68 = *puVar11;
    local_d78 = (ulong *)*puVar8;
  }
  local_d70 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d78);
  local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_e38.field_2._M_allocated_capacity = *puVar11;
    local_e38.field_2._8_8_ = plVar6[3];
  }
  else {
    local_e38.field_2._M_allocated_capacity = *puVar11;
    local_e38._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_e38._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_c58 = &local_c48;
  std::__cxx11::string::_M_construct((ulong)&local_c58,'\x06');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    uVar15 = local_e38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_c50 + local_e38._M_string_length) {
    uVar17 = 0xf;
    if (local_c58 != &local_c48) {
      uVar17 = local_c48;
    }
    if (uVar17 < local_c50 + local_e38._M_string_length) goto LAB_001d8510;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_c58,0,(char *)0x0,(ulong)local_e38._M_dataplus._M_p);
  }
  else {
LAB_001d8510:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e38,(ulong)local_c58);
  }
  local_db8 = &local_da8;
  plVar6 = puVar8 + 2;
  if ((long *)*puVar8 == plVar6) {
    local_da8 = *plVar6;
    lStack_da0 = puVar8[3];
  }
  else {
    local_da8 = *plVar6;
    local_db8 = (long *)*puVar8;
  }
  local_db0 = puVar8[1];
  *puVar8 = plVar6;
  puVar8[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_db8);
  local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
  psVar13 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_dd8.field_2._M_allocated_capacity = *psVar13;
    local_dd8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_dd8.field_2._M_allocated_capacity = *psVar13;
    local_dd8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_dd8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_dd8,(ulong)local_8d8);
  puVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_de8._M_allocated_capacity = *puVar11;
    local_de8._8_8_ = puVar8[3];
    local_df8 = &local_de8;
  }
  else {
    local_de8._M_allocated_capacity = *puVar11;
    local_df8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8;
  }
  local_df0 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_bb8 = &local_ba8;
  std::__cxx11::string::_M_construct((ulong)&local_bb8,'\x06');
  uVar15 = 0xf;
  if (local_df8 != &local_de8) {
    uVar15 = local_de8._M_allocated_capacity;
  }
  if ((ulong)uVar15 < (ulong)(local_bb0 + local_df0)) {
    uVar17 = 0xf;
    if (local_bb8 != &local_ba8) {
      uVar17 = local_ba8;
    }
    if (uVar17 < (ulong)(local_bb0 + local_df0)) goto LAB_001d86b7;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_bb8,0,(char *)0x0,(ulong)local_df8);
  }
  else {
LAB_001d86b7:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_df8,(ulong)local_bb8);
  }
  local_c78 = &local_c68;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_c68 = *puVar11;
    uStack_c60 = puVar8[3];
  }
  else {
    local_c68 = *puVar11;
    local_c78 = (ulong *)*puVar8;
  }
  local_c70 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c78);
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_d08 = *puVar11;
    lStack_d00 = puVar8[3];
    local_d18 = &local_d08;
  }
  else {
    local_d08 = *puVar11;
    local_d18 = (ulong *)*puVar8;
  }
  local_d10 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_b98 = &local_b88;
  std::__cxx11::string::_M_construct((ulong)&local_b98,'\x03');
  uVar17 = 0xf;
  if (local_d18 != &local_d08) {
    uVar17 = local_d08;
  }
  if (uVar17 < (ulong)(local_b90 + local_d10)) {
    uVar17 = 0xf;
    if (local_b98 != &local_b88) {
      uVar17 = local_b88;
    }
    if (uVar17 < (ulong)(local_b90 + local_d10)) goto LAB_001d8807;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b98,0,(char *)0x0,(ulong)local_d18);
  }
  else {
LAB_001d8807:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d18,(ulong)local_b98);
  }
  psVar13 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_cb8.field_2._M_allocated_capacity = *psVar13;
    local_cb8.field_2._8_8_ = puVar8[3];
    local_cb8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_cb8.field_2._M_allocated_capacity = *psVar13;
    local_cb8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_cb8._M_string_length = puVar8[1];
  *puVar8 = psVar13;
  puVar8[1] = 0;
  *(undefined1 *)psVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_cb8);
  psVar13 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_cd8.field_2._M_allocated_capacity = *psVar13;
    local_cd8.field_2._8_8_ = plVar6[3];
    local_cd8._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_cd8.field_2._M_allocated_capacity = *psVar13;
    local_cd8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_cd8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != paVar2) {
    operator_delete(local_cb8._M_dataplus._M_p);
  }
  if (local_b98 != &local_b88) {
    operator_delete(local_b98);
  }
  if (local_d18 != &local_d08) {
    operator_delete(local_d18);
  }
  if (local_c78 != &local_c68) {
    operator_delete(local_c78);
  }
  if (local_bb8 != &local_ba8) {
    operator_delete(local_bb8);
  }
  if (local_df8 != &local_de8) {
    operator_delete(local_df8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
    operator_delete(local_dd8._M_dataplus._M_p);
  }
  if (local_db8 != &local_da8) {
    operator_delete(local_db8);
  }
  if (local_c58 != &local_c48) {
    operator_delete(local_c58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p);
  }
  if (local_d78 != &local_d68) {
    operator_delete(local_d78);
  }
  if (local_c98 != &local_c88) {
    operator_delete(local_c98);
  }
  if (local_d98 != &local_d88) {
    operator_delete(local_d98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p);
  }
  if (local_d58 != &local_d48) {
    operator_delete(local_d58);
  }
  if (local_c18 != &local_c08) {
    operator_delete(local_c18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    operator_delete(local_cf8._M_dataplus._M_p);
  }
  if (local_c38 != &local_c28) {
    operator_delete(local_c38);
  }
  local_8f8 = &local_8e8;
  std::__cxx11::string::_M_construct((ulong)&local_8f8,'\x03');
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_8f8);
  local_998 = &local_988;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_988 = *plVar10;
    lStack_980 = plVar6[3];
  }
  else {
    local_988 = *plVar10;
    local_998 = (long *)*plVar6;
  }
  local_990 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_998);
  local_b38 = &local_b28;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_b28 = *puVar11;
    lStack_b20 = plVar6[3];
  }
  else {
    local_b28 = *puVar11;
    local_b38 = (ulong *)*plVar6;
  }
  local_b30 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_9b8 = &local_9a8;
  std::__cxx11::string::_M_construct((ulong)&local_9b8,'\x03');
  uVar17 = 0xf;
  if (local_b38 != &local_b28) {
    uVar17 = local_b28;
  }
  if (uVar17 < (ulong)(local_9b0 + local_b30)) {
    uVar17 = 0xf;
    if (local_9b8 != &local_9a8) {
      uVar17 = local_9a8;
    }
    if (uVar17 < (ulong)(local_9b0 + local_b30)) goto LAB_001d8be5;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9b8,0,(char *)0x0,(ulong)local_b38);
  }
  else {
LAB_001d8be5:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b38,(ulong)local_9b8);
  }
  local_b18 = &local_b08;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_b08 = *puVar11;
    uStack_b00 = puVar8[3];
  }
  else {
    local_b08 = *puVar11;
    local_b18 = (ulong *)*puVar8;
  }
  local_b10 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b18);
  local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_af8.field_2._M_allocated_capacity = *puVar11;
    local_af8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_af8.field_2._M_allocated_capacity = *puVar11;
    local_af8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_af8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_e18 = &local_e08;
  std::__cxx11::string::_M_construct((ulong)&local_e18,'\x06');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    uVar15 = local_af8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_e10 + local_af8._M_string_length) {
    uVar17 = 0xf;
    if (local_e18 != &local_e08) {
      uVar17 = local_e08;
    }
    if (uVar17 < local_e10 + local_af8._M_string_length) goto LAB_001d8d39;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_e18,0,(char *)0x0,(ulong)local_af8._M_dataplus._M_p);
  }
  else {
LAB_001d8d39:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_af8,(ulong)local_e18);
  }
  local_bd8 = &local_bc8;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_bc8 = *puVar1;
    uStack_bc0 = puVar8[3];
  }
  else {
    local_bc8 = *puVar1;
    local_bd8 = (undefined8 *)*puVar8;
  }
  local_bd0 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_bd8);
  local_ab8 = &local_aa8;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_aa8 = *puVar11;
    lStack_aa0 = plVar6[3];
  }
  else {
    local_aa8 = *puVar11;
    local_ab8 = (ulong *)*plVar6;
  }
  local_ab0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_a38 = &local_a28;
  std::__cxx11::string::_M_construct((ulong)&local_a38,'\x06');
  uVar17 = 0xf;
  if (local_ab8 != &local_aa8) {
    uVar17 = local_aa8;
  }
  if (uVar17 < (ulong)(local_a30 + local_ab0)) {
    uVar17 = 0xf;
    if (local_a38 != &local_a28) {
      uVar17 = local_a28;
    }
    if (uVar17 < (ulong)(local_a30 + local_ab0)) goto LAB_001d8e99;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a38,0,(char *)0x0,(ulong)local_ab8);
  }
  else {
LAB_001d8e99:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ab8,(ulong)local_a38);
  }
  local_bf8 = &local_be8;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_be8 = *puVar11;
    lStack_be0 = puVar8[3];
  }
  else {
    local_be8 = *puVar11;
    local_bf8 = (ulong *)*puVar8;
  }
  local_bf0 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_bf8);
  local_b78 = &local_b68;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_b68 = *puVar11;
    uStack_b60 = puVar8[3];
  }
  else {
    local_b68 = *puVar11;
    local_b78 = (ulong *)*puVar8;
  }
  local_b70 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_9d8 = &local_9c8;
  std::__cxx11::string::_M_construct((ulong)&local_9d8,'\x06');
  uVar17 = 0xf;
  if (local_b78 != &local_b68) {
    uVar17 = local_b68;
  }
  if (uVar17 < (ulong)(local_9d0 + local_b70)) {
    uVar17 = 0xf;
    if (local_9d8 != &local_9c8) {
      uVar17 = local_9c8;
    }
    if (uVar17 < (ulong)(local_9d0 + local_b70)) goto LAB_001d8fff;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9d8,0,(char *)0x0,(ulong)local_b78);
  }
  else {
LAB_001d8fff:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b78,(ulong)local_9d8);
  }
  local_ad8 = &local_ac8;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_ac8 = *puVar11;
    lStack_ac0 = puVar8[3];
  }
  else {
    local_ac8 = *puVar11;
    local_ad8 = (ulong *)*puVar8;
  }
  local_ad0 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_ad8);
  local_b58 = &local_b48;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_b48 = *puVar11;
    lStack_b40 = plVar6[3];
  }
  else {
    local_b48 = *puVar11;
    local_b58 = (ulong *)*plVar6;
  }
  local_b50 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_a58 = &local_a48;
  std::__cxx11::string::_M_construct((ulong)&local_a58,'\x06');
  uVar17 = 0xf;
  if (local_b58 != &local_b48) {
    uVar17 = local_b48;
  }
  if (uVar17 < (ulong)(local_a50 + local_b50)) {
    uVar17 = 0xf;
    if (local_a58 != &local_a48) {
      uVar17 = local_a48;
    }
    if (uVar17 < (ulong)(local_a50 + local_b50)) goto LAB_001d9165;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a58,0,(char *)0x0,(ulong)local_b58);
  }
  else {
LAB_001d9165:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b58,(ulong)local_a58);
  }
  local_b98 = &local_b88;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_b88 = *puVar11;
    lStack_b80 = puVar8[3];
  }
  else {
    local_b88 = *puVar11;
    local_b98 = (ulong *)*puVar8;
  }
  local_b90 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b98);
  local_bb8 = &local_ba8;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_ba8 = *puVar11;
    lStack_ba0 = plVar6[3];
  }
  else {
    local_ba8 = *puVar11;
    local_bb8 = (ulong *)*plVar6;
  }
  local_bb0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_9f8 = &local_9e8;
  std::__cxx11::string::_M_construct((ulong)&local_9f8,'\x06');
  uVar17 = 0xf;
  if (local_bb8 != &local_ba8) {
    uVar17 = local_ba8;
  }
  if (uVar17 < (ulong)(local_9f0 + local_bb0)) {
    uVar17 = 0xf;
    if (local_9f8 != &local_9e8) {
      uVar17 = local_9e8;
    }
    if (uVar17 < (ulong)(local_9f0 + local_bb0)) goto LAB_001d92d3;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9f8,0,(char *)0x0,(ulong)local_bb8);
  }
  else {
LAB_001d92d3:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bb8,(ulong)local_9f8);
  }
  local_c58 = &local_c48;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_c48 = *puVar11;
    lStack_c40 = puVar8[3];
  }
  else {
    local_c48 = *puVar11;
    local_c58 = (ulong *)*puVar8;
  }
  local_c50 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c58);
  local_c98 = &local_c88;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_c88 = *puVar11;
    uStack_c80 = puVar8[3];
  }
  else {
    local_c88 = *puVar11;
    local_c98 = (ulong *)*puVar8;
  }
  local_c90 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_918 = &local_908;
  std::__cxx11::string::_M_construct((ulong)&local_918,'\t');
  uVar17 = 0xf;
  if (local_c98 != &local_c88) {
    uVar17 = local_c88;
  }
  if (uVar17 < (ulong)(local_910 + local_c90)) {
    uVar17 = 0xf;
    if (local_918 != &local_908) {
      uVar17 = local_908;
    }
    if (uVar17 < (ulong)(local_910 + local_c90)) goto LAB_001d9441;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_918,0,(char *)0x0,(ulong)local_c98);
  }
  else {
LAB_001d9441:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c98,(ulong)local_918);
  }
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_c08 = *puVar11;
    lStack_c00 = puVar8[3];
    local_c18 = &local_c08;
  }
  else {
    local_c08 = *puVar11;
    local_c18 = (ulong *)*puVar8;
  }
  local_c10 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c18);
  local_c38 = &local_c28;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_c28 = *puVar11;
    lStack_c20 = plVar6[3];
  }
  else {
    local_c28 = *puVar11;
    local_c38 = (ulong *)*plVar6;
  }
  local_c30 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_938 = &local_928;
  std::__cxx11::string::_M_construct((ulong)&local_938,'\t');
  uVar17 = 0xf;
  if (local_c38 != &local_c28) {
    uVar17 = local_c28;
  }
  if (uVar17 < (ulong)(local_930 + local_c30)) {
    uVar17 = 0xf;
    if (local_938 != &local_928) {
      uVar17 = local_928;
    }
    if (uVar17 < (ulong)(local_930 + local_c30)) goto LAB_001d95a8;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_938,0,(char *)0x0,(ulong)local_c38);
  }
  else {
LAB_001d95a8:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c38,(ulong)local_938);
  }
  local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
  puVar11 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_cf8.field_2._M_allocated_capacity = *puVar11;
    local_cf8.field_2._8_8_ = puVar8[3];
  }
  else {
    local_cf8.field_2._M_allocated_capacity = *puVar11;
    local_cf8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_cf8._M_string_length = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_cf8);
  local_d58 = &local_d48;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_d48 = *puVar11;
    uStack_d40 = puVar8[3];
  }
  else {
    local_d48 = *puVar11;
    local_d58 = (ulong *)*puVar8;
  }
  local_d50 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_958 = &local_948;
  std::__cxx11::string::_M_construct((ulong)&local_958,'\x06');
  uVar17 = 0xf;
  if (local_d58 != &local_d48) {
    uVar17 = local_d48;
  }
  if (uVar17 < (ulong)(local_950 + local_d50)) {
    uVar17 = 0xf;
    if (local_958 != &local_948) {
      uVar17 = local_948;
    }
    if (uVar17 < (ulong)(local_950 + local_d50)) goto LAB_001d9716;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_958,0,(char *)0x0,(ulong)local_d58);
  }
  else {
LAB_001d9716:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d58,(ulong)local_958);
  }
  local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
  psVar13 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_d38.field_2._M_allocated_capacity = *psVar13;
    local_d38.field_2._8_8_ = puVar8[3];
  }
  else {
    local_d38.field_2._M_allocated_capacity = *psVar13;
    local_d38._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_d38._M_string_length = puVar8[1];
  *puVar8 = psVar13;
  puVar8[1] = 0;
  *(undefined1 *)psVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d38);
  local_d98 = &local_d88;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_d88 = *puVar11;
    lStack_d80 = plVar6[3];
  }
  else {
    local_d88 = *puVar11;
    local_d98 = (ulong *)*plVar6;
  }
  local_d90 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_978 = &local_968;
  std::__cxx11::string::_M_construct((ulong)&local_978,'\x06');
  uVar17 = 0xf;
  if (local_d98 != &local_d88) {
    uVar17 = local_d88;
  }
  if (uVar17 < (ulong)(local_970 + local_d90)) {
    uVar17 = 0xf;
    if (local_978 != &local_968) {
      uVar17 = local_968;
    }
    if (uVar17 < (ulong)(local_970 + local_d90)) goto LAB_001d9884;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_978,0,(char *)0x0,(ulong)local_d98);
  }
  else {
LAB_001d9884:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d98,(ulong)local_978);
  }
  local_d78 = &local_d68;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_d68 = *puVar11;
    lStack_d60 = puVar8[3];
  }
  else {
    local_d68 = *puVar11;
    local_d78 = (ulong *)*puVar8;
  }
  local_d70 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d78);
  local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_e38.field_2._M_allocated_capacity = *puVar11;
    local_e38.field_2._8_8_ = plVar6[3];
  }
  else {
    local_e38.field_2._M_allocated_capacity = *puVar11;
    local_e38._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_e38._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_a78 = &local_a68;
  std::__cxx11::string::_M_construct((ulong)&local_a78,'\t');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    uVar15 = local_e38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_a70 + local_e38._M_string_length) {
    uVar17 = 0xf;
    if (local_a78 != &local_a68) {
      uVar17 = local_a68;
    }
    if (uVar17 < local_a70 + local_e38._M_string_length) goto LAB_001d99d7;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_a78,0,(char *)0x0,(ulong)local_e38._M_dataplus._M_p);
  }
  else {
LAB_001d99d7:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e38,(ulong)local_a78);
  }
  local_db8 = &local_da8;
  plVar6 = puVar8 + 2;
  if ((long *)*puVar8 == plVar6) {
    local_da8 = *plVar6;
    lStack_da0 = puVar8[3];
  }
  else {
    local_da8 = *plVar6;
    local_db8 = (long *)*puVar8;
  }
  local_db0 = puVar8[1];
  *puVar8 = plVar6;
  puVar8[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_db8);
  local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_dd8.field_2._M_allocated_capacity = *puVar11;
    local_dd8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_dd8.field_2._M_allocated_capacity = *puVar11;
    local_dd8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_dd8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_a18 = &local_a08;
  std::__cxx11::string::_M_construct((ulong)&local_a18,'\x06');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
    uVar15 = local_dd8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_a10 + local_dd8._M_string_length) {
    uVar17 = 0xf;
    if (local_a18 != &local_a08) {
      uVar17 = local_a08;
    }
    if (uVar17 < local_a10 + local_dd8._M_string_length) goto LAB_001d9b33;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_a18,0,(char *)0x0,(ulong)local_dd8._M_dataplus._M_p);
  }
  else {
LAB_001d9b33:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_dd8,(ulong)local_a18);
  }
  psVar13 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_de8._M_allocated_capacity = *psVar13;
    local_de8._8_8_ = puVar8[3];
    local_df8 = &local_de8;
  }
  else {
    local_de8._M_allocated_capacity = *psVar13;
    local_df8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8;
  }
  local_df0 = puVar8[1];
  *puVar8 = psVar13;
  puVar8[1] = 0;
  *(undefined1 *)psVar13 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_df8);
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_c68 = *puVar11;
    uStack_c60 = puVar8[3];
    local_c78 = &local_c68;
  }
  else {
    local_c68 = *puVar11;
    local_c78 = (ulong *)*puVar8;
  }
  local_c70 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_a98 = &local_a88;
  std::__cxx11::string::_M_construct((ulong)&local_a98,'\x03');
  uVar17 = 0xf;
  if (local_c78 != &local_c68) {
    uVar17 = local_c68;
  }
  if (uVar17 < (ulong)(local_a90 + local_c70)) {
    uVar17 = 0xf;
    if (local_a98 != &local_a88) {
      uVar17 = local_a88;
    }
    if (uVar17 < (ulong)(local_a90 + local_c70)) goto LAB_001d9c7b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a98,0,(char *)0x0,(ulong)local_c78);
  }
  else {
LAB_001d9c7b:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c78,(ulong)local_a98);
  }
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_d08 = *puVar11;
    lStack_d00 = puVar8[3];
    local_d18 = &local_d08;
  }
  else {
    local_d08 = *puVar11;
    local_d18 = (ulong *)*puVar8;
  }
  local_d10 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d18);
  psVar13 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_cb8.field_2._M_allocated_capacity = *psVar13;
    local_cb8.field_2._8_8_ = plVar6[3];
    local_cb8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_cb8.field_2._M_allocated_capacity = *psVar13;
    local_cb8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_cb8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_d18 != &local_d08) {
    operator_delete(local_d18);
  }
  if (local_a98 != &local_a88) {
    operator_delete(local_a98);
  }
  if (local_c78 != &local_c68) {
    operator_delete(local_c78);
  }
  if (local_df8 != &local_de8) {
    operator_delete(local_df8);
  }
  if (local_a18 != &local_a08) {
    operator_delete(local_a18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
    operator_delete(local_dd8._M_dataplus._M_p);
  }
  if (local_db8 != &local_da8) {
    operator_delete(local_db8);
  }
  if (local_a78 != &local_a68) {
    operator_delete(local_a78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p);
  }
  if (local_d78 != &local_d68) {
    operator_delete(local_d78);
  }
  if (local_978 != &local_968) {
    operator_delete(local_978);
  }
  if (local_d98 != &local_d88) {
    operator_delete(local_d98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p);
  }
  if (local_958 != &local_948) {
    operator_delete(local_958);
  }
  if (local_d58 != &local_d48) {
    operator_delete(local_d58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    operator_delete(local_cf8._M_dataplus._M_p);
  }
  if (local_938 != &local_928) {
    operator_delete(local_938);
  }
  if (local_c38 != &local_c28) {
    operator_delete(local_c38);
  }
  if (local_c18 != &local_c08) {
    operator_delete(local_c18);
  }
  if (local_918 != &local_908) {
    operator_delete(local_918);
  }
  if (local_c98 != &local_c88) {
    operator_delete(local_c98);
  }
  if (local_c58 != &local_c48) {
    operator_delete(local_c58);
  }
  if (local_9f8 != &local_9e8) {
    operator_delete(local_9f8);
  }
  if (local_bb8 != &local_ba8) {
    operator_delete(local_bb8);
  }
  if (local_b98 != &local_b88) {
    operator_delete(local_b98);
  }
  if (local_a58 != &local_a48) {
    operator_delete(local_a58);
  }
  if (local_b58 != &local_b48) {
    operator_delete(local_b58);
  }
  if (local_ad8 != &local_ac8) {
    operator_delete(local_ad8);
  }
  if (local_9d8 != &local_9c8) {
    operator_delete(local_9d8);
  }
  if (local_b78 != &local_b68) {
    operator_delete(local_b78);
  }
  if (local_bf8 != &local_be8) {
    operator_delete(local_bf8);
  }
  if (local_a38 != &local_a28) {
    operator_delete(local_a38);
  }
  if (local_ab8 != &local_aa8) {
    operator_delete(local_ab8);
  }
  if (local_bd8 != &local_bc8) {
    operator_delete(local_bd8);
  }
  if (local_e18 != &local_e08) {
    operator_delete(local_e18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    operator_delete(local_af8._M_dataplus._M_p);
  }
  if (local_b18 != &local_b08) {
    operator_delete(local_b18);
  }
  if (local_9b8 != &local_9a8) {
    operator_delete(local_9b8);
  }
  if (local_b38 != &local_b28) {
    operator_delete(local_b38);
  }
  if (local_998 != &local_988) {
    operator_delete(local_998);
  }
  if (local_8f8 != &local_8e8) {
    operator_delete(local_8f8);
  }
  local_d18 = &local_d08;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d18,"");
  local_c78 = &local_c68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c78,"");
  uVar17 = 0;
  do {
    if (((this->super_Application)._features.super__Base_bitset<2UL>._M_w[uVar17 >> 6] >>
         (uVar17 & 0x3f) & 1) != 0) {
      pAVar7 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar17);
      if (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[uVar17 >> 6]
          & 1L << ((byte)uVar17 & 0x3f)) == 0) {
        std::operator+(&local_cf8,"+((tuple.",&pAVar7->_name);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_cf8);
        local_d58 = &local_d48;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_d48 = *puVar11;
          uStack_d40 = puVar8[3];
        }
        else {
          local_d48 = *puVar11;
          local_d58 = (ulong *)*puVar8;
        }
        local_d50 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_d58,(ulong)(pAVar7->_name)._M_dataplus._M_p);
        local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
        psVar13 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_d38.field_2._M_allocated_capacity = *psVar13;
          local_d38.field_2._8_8_ = puVar8[3];
        }
        else {
          local_d38.field_2._M_allocated_capacity = *psVar13;
          local_d38._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_d38._M_string_length = puVar8[1];
        *puVar8 = psVar13;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d38);
        local_d98 = &local_d88;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_d88 = *puVar11;
          lStack_d80 = puVar8[3];
        }
        else {
          local_d88 = *puVar11;
          local_d98 = (ulong *)*puVar8;
        }
        local_d90 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d98);
        local_d78 = &local_d68;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_d68 = *puVar11;
          lStack_d60 = puVar8[3];
        }
        else {
          local_d68 = *puVar11;
          local_d78 = (ulong *)*puVar8;
        }
        local_d70 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_d78,(ulong)(pAVar7->_name)._M_dataplus._M_p);
        local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_e38.field_2._M_allocated_capacity = *puVar11;
          local_e38.field_2._8_8_ = puVar8[3];
        }
        else {
          local_e38.field_2._M_allocated_capacity = *puVar11;
          local_e38._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_e38._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_e38);
        local_db8 = &local_da8;
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_da8 = *plVar6;
          lStack_da0 = puVar8[3];
        }
        else {
          local_da8 = *plVar6;
          local_db8 = (long *)*puVar8;
        }
        local_db0 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_db8,(ulong)(pAVar7->_name)._M_dataplus._M_p);
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_dd8.field_2._M_allocated_capacity = *puVar11;
          local_dd8.field_2._8_8_ = puVar8[3];
          local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
        }
        else {
          local_dd8.field_2._M_allocated_capacity = *puVar11;
          local_dd8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_dd8._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_dd8);
        psVar13 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_de8._M_allocated_capacity = *psVar13;
          local_de8._8_8_ = puVar8[3];
          local_df8 = &local_de8;
        }
        else {
          local_de8._M_allocated_capacity = *psVar13;
          local_df8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
        }
        local_df0 = puVar8[1];
        *puVar8 = psVar13;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_d18,(ulong)local_df8);
        if (local_df8 != &local_de8) {
          operator_delete(local_df8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
          operator_delete(local_dd8._M_dataplus._M_p);
        }
        if (local_db8 != &local_da8) {
          operator_delete(local_db8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
          operator_delete(local_e38._M_dataplus._M_p);
        }
        if (local_d78 != &local_d68) {
          operator_delete(local_d78);
        }
        if (local_d98 != &local_d88) {
          operator_delete(local_d98);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
          operator_delete(local_d38._M_dataplus._M_p);
        }
        if (local_d58 != &local_d48) {
          operator_delete(local_d58);
        }
        _Var16._M_p = local_cf8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cf8._M_dataplus._M_p == &local_cf8.field_2) goto LAB_001db6ab;
      }
      else {
        uVar38 = **(ulong **)
                   &((*(this->varToQuery[uVar17]->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ;
        cVar18 = '\x01';
        if (9 < uVar38) {
          uVar14 = uVar38;
          cVar30 = '\x04';
          do {
            cVar18 = cVar30;
            if (uVar14 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_001da724;
            }
            if (uVar14 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_001da724;
            }
            if (uVar14 < 10000) goto LAB_001da724;
            bVar3 = 99999 < uVar14;
            uVar14 = uVar14 / 10000;
            cVar30 = cVar18 + '\x04';
          } while (bVar3);
          cVar18 = cVar18 + '\x01';
        }
LAB_001da724:
        local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_dd8,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_dd8._M_dataplus._M_p,(uint)local_dd8._M_string_length,uVar38);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_dd8,0,(char *)0x0,0x2a8219);
        local_df8 = &local_de8;
        psVar13 = puVar8 + 2;
        paVar2 = &local_dd8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_de8._M_allocated_capacity = *psVar13;
          local_de8._8_8_ = puVar8[3];
        }
        else {
          local_de8._M_allocated_capacity = *psVar13;
          local_df8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
        }
        local_df0 = puVar8[1];
        *puVar8 = psVar13;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_dd8._M_dataplus._M_p != paVar2) {
          operator_delete(local_dd8._M_dataplus._M_p);
        }
        std::operator+(&local_d38,"-2*means[cluster].cluster_",&pAVar7->_name);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_d38);
        local_d98 = &local_d88;
        puVar11 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar11) {
          local_d88 = *puVar11;
          lStack_d80 = plVar6[3];
        }
        else {
          local_d88 = *puVar11;
          local_d98 = (ulong *)*plVar6;
        }
        local_d90 = plVar6[1];
        *plVar6 = (long)puVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d98,(ulong)(pAVar7->_name)._M_dataplus._M_p);
        local_d78 = &local_d68;
        puVar11 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar11) {
          local_d68 = *puVar11;
          lStack_d60 = plVar6[3];
        }
        else {
          local_d68 = *puVar11;
          local_d78 = (ulong *)*plVar6;
        }
        local_d70 = plVar6[1];
        *plVar6 = (long)puVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_d78);
        local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
        psVar13 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_e38.field_2._M_allocated_capacity = *psVar13;
          local_e38.field_2._8_8_ = plVar6[3];
        }
        else {
          local_e38.field_2._M_allocated_capacity = *psVar13;
          local_e38._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_e38._M_string_length = plVar6[1];
        *plVar6 = (long)psVar13;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_e38,(ulong)(pAVar7->_name)._M_dataplus._M_p);
        local_db8 = &local_da8;
        plVar10 = plVar6 + 2;
        if ((long *)*plVar6 == plVar10) {
          local_da8 = *plVar10;
          lStack_da0 = plVar6[3];
        }
        else {
          local_da8 = *plVar10;
          local_db8 = (long *)*plVar6;
        }
        local_db0 = plVar6[1];
        *plVar6 = (long)plVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_db8);
        psVar13 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_dd8.field_2._M_allocated_capacity = *psVar13;
          local_dd8.field_2._8_8_ = plVar6[3];
          local_dd8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_dd8.field_2._M_allocated_capacity = *psVar13;
          local_dd8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_dd8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar13;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_d18,(ulong)local_dd8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_dd8._M_dataplus._M_p != paVar2) {
          operator_delete(local_dd8._M_dataplus._M_p);
        }
        if (local_db8 != &local_da8) {
          operator_delete(local_db8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
          operator_delete(local_e38._M_dataplus._M_p);
        }
        if (local_d78 != &local_d68) {
          operator_delete(local_d78);
        }
        if (local_d98 != &local_d88) {
          operator_delete(local_d98);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
          operator_delete(local_d38._M_dataplus._M_p);
        }
        local_bd8 = &local_bc8;
        std::__cxx11::string::_M_construct((ulong)&local_bd8,'\x06');
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_bd8,0,(char *)0x0,0x2b2de1);
        local_ab8 = &local_aa8;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_aa8 = *puVar11;
          lStack_aa0 = puVar8[3];
        }
        else {
          local_aa8 = *puVar11;
          local_ab8 = (ulong *)*puVar8;
        }
        local_ab0 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_ab8);
        local_bf8 = &local_be8;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_be8 = *puVar11;
          lStack_be0 = puVar8[3];
        }
        else {
          local_be8 = *puVar11;
          local_bf8 = (ulong *)*puVar8;
        }
        local_bf0 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        Application::typeToStr_abi_cxx11_(&local_af8,&this->super_Application,pAVar7->_type);
        uVar38 = 0xf;
        if (local_bf8 != &local_be8) {
          uVar38 = local_be8;
        }
        if (uVar38 < local_af8._M_string_length + local_bf0) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
            uVar15 = local_af8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_af8._M_string_length + local_bf0) goto LAB_001dabef;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_af8,0,(char *)0x0,(ulong)local_bf8);
        }
        else {
LAB_001dabef:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_bf8,(ulong)local_af8._M_dataplus._M_p);
        }
        local_b78 = &local_b68;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_b68 = *puVar11;
          uStack_b60 = puVar8[3];
        }
        else {
          local_b68 = *puVar11;
          local_b78 = (ulong *)*puVar8;
        }
        local_b70 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)puVar11 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_b78);
        local_ad8 = &local_ac8;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_ac8 = *puVar11;
          lStack_ac0 = puVar8[3];
        }
        else {
          local_ac8 = *puVar11;
          local_ad8 = (ulong *)*puVar8;
        }
        local_ad0 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_ad8,(ulong)(pAVar7->_name)._M_dataplus._M_p);
        local_b58 = &local_b48;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_b48 = *puVar11;
          lStack_b40 = puVar8[3];
        }
        else {
          local_b48 = *puVar11;
          local_b58 = (ulong *)*puVar8;
        }
        local_b50 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_b58);
        local_b98 = &local_b88;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_b88 = *puVar11;
          lStack_b80 = puVar8[3];
        }
        else {
          local_b88 = *puVar11;
          local_b98 = (ulong *)*puVar8;
        }
        local_b90 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b98,(ulong)local_df8);
        local_bb8 = &local_ba8;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_ba8 = *puVar11;
          lStack_ba0 = puVar8[3];
        }
        else {
          local_ba8 = *puVar11;
          local_bb8 = (ulong *)*puVar8;
        }
        local_bb0 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_bb8);
        local_c58 = &local_c48;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_c48 = *puVar11;
          lStack_c40 = puVar8[3];
        }
        else {
          local_c48 = *puVar11;
          local_c58 = (ulong *)*puVar8;
        }
        local_c50 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        local_b18 = &local_b08;
        std::__cxx11::string::_M_construct((ulong)&local_b18,'\x06');
        uVar38 = 0xf;
        if (local_c58 != &local_c48) {
          uVar38 = local_c48;
        }
        if (uVar38 < (ulong)(local_b10 + local_c50)) {
          uVar38 = 0xf;
          if (local_b18 != &local_b08) {
            uVar38 = local_b08;
          }
          if (uVar38 < (ulong)(local_b10 + local_c50)) goto LAB_001daf11;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_b18,0,(char *)0x0,(ulong)local_c58);
        }
        else {
LAB_001daf11:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_c58,(ulong)local_b18);
        }
        local_c98 = &local_c88;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_c88 = *puVar11;
          uStack_c80 = puVar8[3];
        }
        else {
          local_c88 = *puVar11;
          local_c98 = (ulong *)*puVar8;
        }
        local_c90 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)puVar11 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c98);
        local_c18 = &local_c08;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_c08 = *puVar11;
          lStack_c00 = puVar8[3];
        }
        else {
          local_c08 = *puVar11;
          local_c18 = (ulong *)*puVar8;
        }
        local_c10 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c18,(ulong)local_df8);
        local_c38 = &local_c28;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_c28 = *puVar11;
          lStack_c20 = puVar8[3];
        }
        else {
          local_c28 = *puVar11;
          local_c38 = (ulong *)*puVar8;
        }
        local_c30 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c38);
        local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_cf8.field_2._M_allocated_capacity = *puVar11;
          local_cf8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_cf8.field_2._M_allocated_capacity = *puVar11;
          local_cf8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_cf8._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        local_b38 = &local_b28;
        std::__cxx11::string::_M_construct((ulong)&local_b38,'\t');
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
          uVar15 = local_cf8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_b30 + local_cf8._M_string_length) {
          uVar38 = 0xf;
          if (local_b38 != &local_b28) {
            uVar38 = local_b28;
          }
          if (uVar38 < local_b30 + local_cf8._M_string_length) goto LAB_001db161;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_b38,0,(char *)0x0,(ulong)local_cf8._M_dataplus._M_p);
        }
        else {
LAB_001db161:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_cf8,(ulong)local_b38);
        }
        local_d58 = &local_d48;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_d48 = *puVar11;
          uStack_d40 = puVar8[3];
        }
        else {
          local_d48 = *puVar11;
          local_d58 = (ulong *)*puVar8;
        }
        local_d50 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)puVar11 = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_d58,(ulong)(pAVar7->_name)._M_dataplus._M_p);
        local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
        psVar13 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_d38.field_2._M_allocated_capacity = *psVar13;
          local_d38.field_2._8_8_ = puVar8[3];
        }
        else {
          local_d38.field_2._M_allocated_capacity = *psVar13;
          local_d38._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_d38._M_string_length = puVar8[1];
        *puVar8 = psVar13;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d38);
        local_d98 = &local_d88;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_d88 = *puVar11;
          lStack_d80 = puVar8[3];
        }
        else {
          local_d88 = *puVar11;
          local_d98 = (ulong *)*puVar8;
        }
        local_d90 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d98,(ulong)local_df8);
        local_d78 = &local_d68;
        puVar11 = puVar8 + 2;
        if ((ulong *)*puVar8 == puVar11) {
          local_d68 = *puVar11;
          lStack_d60 = puVar8[3];
        }
        else {
          local_d68 = *puVar11;
          local_d78 = (ulong *)*puVar8;
        }
        local_d70 = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d78);
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_e38.field_2._M_allocated_capacity = *puVar11;
          local_e38.field_2._8_8_ = puVar8[3];
          local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
        }
        else {
          local_e38.field_2._M_allocated_capacity = *puVar11;
          local_e38._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_e38._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_e38,(ulong)(pAVar7->_name)._M_dataplus._M_p);
        plVar6 = puVar8 + 2;
        if ((long *)*puVar8 == plVar6) {
          local_da8 = *plVar6;
          lStack_da0 = puVar8[3];
          local_db8 = &local_da8;
        }
        else {
          local_da8 = *plVar6;
          local_db8 = (long *)*puVar8;
        }
        local_db0 = puVar8[1];
        *puVar8 = plVar6;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_db8);
        puVar11 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_dd8.field_2._M_allocated_capacity = *puVar11;
          local_dd8.field_2._8_8_ = puVar8[3];
          local_dd8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_dd8.field_2._M_allocated_capacity = *puVar11;
          local_dd8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_dd8._M_string_length = puVar8[1];
        *puVar8 = puVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_c78,(ulong)local_dd8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_dd8._M_dataplus._M_p != paVar2) {
          operator_delete(local_dd8._M_dataplus._M_p);
        }
        if (local_db8 != &local_da8) {
          operator_delete(local_db8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
          operator_delete(local_e38._M_dataplus._M_p);
        }
        if (local_d78 != &local_d68) {
          operator_delete(local_d78);
        }
        if (local_d98 != &local_d88) {
          operator_delete(local_d98);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
          operator_delete(local_d38._M_dataplus._M_p);
        }
        if (local_d58 != &local_d48) {
          operator_delete(local_d58);
        }
        if (local_b38 != &local_b28) {
          operator_delete(local_b38);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
          operator_delete(local_cf8._M_dataplus._M_p);
        }
        if (local_c38 != &local_c28) {
          operator_delete(local_c38);
        }
        if (local_c18 != &local_c08) {
          operator_delete(local_c18);
        }
        if (local_c98 != &local_c88) {
          operator_delete(local_c98);
        }
        if (local_b18 != &local_b08) {
          operator_delete(local_b18);
        }
        if (local_c58 != &local_c48) {
          operator_delete(local_c58);
        }
        if (local_bb8 != &local_ba8) {
          operator_delete(local_bb8);
        }
        if (local_b98 != &local_b88) {
          operator_delete(local_b98);
        }
        if (local_b58 != &local_b48) {
          operator_delete(local_b58);
        }
        if (local_ad8 != &local_ac8) {
          operator_delete(local_ad8);
        }
        if (local_b78 != &local_b68) {
          operator_delete(local_b78);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
          operator_delete(local_af8._M_dataplus._M_p);
        }
        if (local_bf8 != &local_be8) {
          operator_delete(local_bf8);
        }
        if (local_ab8 != &local_aa8) {
          operator_delete(local_ab8);
        }
        if (local_bd8 != &local_bc8) {
          operator_delete(local_bd8);
        }
        _Var16._M_p = (pointer)local_df8;
        if (local_df8 == &local_de8) goto LAB_001db6ab;
      }
      operator_delete(_Var16._M_p);
    }
LAB_001db6ab:
    uVar17 = uVar17 + 1;
  } while (uVar17 != 100);
  auVar27 = *(undefined1 (*) [16])
             (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w;
  auVar39._0_2_ = auVar27._0_2_ >> 1;
  auVar39._2_2_ = auVar27._2_2_ >> 1;
  auVar39._4_2_ = auVar27._4_2_ >> 1;
  auVar39._6_2_ = auVar27._6_2_ >> 1;
  auVar39._8_2_ = auVar27._8_2_ >> 1;
  auVar39._10_2_ = auVar27._10_2_ >> 1;
  auVar39._12_2_ = auVar27._12_2_ >> 1;
  auVar39._14_2_ = auVar27._14_2_ >> 1;
  auVar39 = auVar39 & _DAT_002b0050;
  uVar19 = CONCAT11(auVar27[1] - auVar39[1],auVar27[0] - auVar39[0]);
  uVar20 = CONCAT13(auVar27[3] - auVar39[3],CONCAT12(auVar27[2] - auVar39[2],uVar19));
  uVar21 = CONCAT15(auVar27[5] - auVar39[5],CONCAT14(auVar27[4] - auVar39[4],uVar20));
  uVar15 = CONCAT17(auVar27[7] - auVar39[7],CONCAT16(auVar27[6] - auVar39[6],uVar21));
  auVar22._0_10_ = CONCAT19(auVar27[9] - auVar39[9],CONCAT18(auVar27[8] - auVar39[8],uVar15));
  auVar22[10] = auVar27[10] - auVar39[10];
  auVar22[0xb] = auVar27[0xb] - auVar39[0xb];
  auVar24[0xc] = auVar27[0xc] - auVar39[0xc];
  auVar24._0_12_ = auVar22;
  auVar24[0xd] = auVar27[0xd] - auVar39[0xd];
  auVar26[0xe] = auVar27[0xe] - auVar39[0xe];
  auVar26._0_14_ = auVar24;
  auVar26[0xf] = auVar27[0xf] - auVar39[0xf];
  auVar39 = auVar26 & _DAT_002b0060;
  auVar27._0_2_ = uVar19 >> 2;
  auVar27._2_2_ = (ushort)((uint)uVar20 >> 0x12);
  auVar27._4_2_ = (ushort)((uint6)uVar21 >> 0x22);
  auVar27._6_2_ = (ushort)((ulong)uVar15 >> 0x32);
  auVar27._8_2_ = (ushort)((unkuint10)auVar22._0_10_ >> 0x42);
  auVar27._10_2_ = auVar22._10_2_ >> 2;
  auVar27._12_2_ = auVar24._12_2_ >> 2;
  auVar27._14_2_ = auVar26._14_2_ >> 2;
  auVar27 = auVar27 & _DAT_002b0060;
  cVar18 = auVar27[0] + auVar39[0];
  bVar29 = auVar27[1] + auVar39[1];
  uVar19 = CONCAT11(bVar29,cVar18);
  cVar30 = auVar27[2] + auVar39[2];
  bVar31 = auVar27[3] + auVar39[3];
  uVar20 = CONCAT13(bVar31,CONCAT12(cVar30,uVar19));
  cVar32 = auVar27[4] + auVar39[4];
  bVar33 = auVar27[5] + auVar39[5];
  uVar21 = CONCAT15(bVar33,CONCAT14(cVar32,uVar20));
  cVar34 = auVar27[6] + auVar39[6];
  bVar35 = auVar27[7] + auVar39[7];
  uVar15 = CONCAT17(bVar35,CONCAT16(cVar34,uVar21));
  cVar36 = auVar27[8] + auVar39[8];
  bVar37 = auVar27[9] + auVar39[9];
  auVar23._0_10_ = CONCAT19(bVar37,CONCAT18(cVar36,uVar15));
  auVar23[10] = auVar27[10] + auVar39[10];
  auVar23[0xb] = auVar27[0xb] + auVar39[0xb];
  auVar25[0xc] = auVar27[0xc] + auVar39[0xc];
  auVar25._0_12_ = auVar23;
  auVar25[0xd] = auVar27[0xd] + auVar39[0xd];
  auVar28[0xe] = auVar27[0xe] + auVar39[0xe];
  auVar28._0_14_ = auVar25;
  auVar28[0xf] = auVar27[0xf] + auVar39[0xf];
  auVar40[0] = (char)(uVar19 >> 4) + cVar18;
  auVar40[1] = (bVar29 >> 4) + bVar29;
  auVar40[2] = (char)(ushort)((uint)uVar20 >> 0x14) + cVar30;
  auVar40[3] = (bVar31 >> 4) + bVar31;
  auVar40[4] = (char)(ushort)((uint6)uVar21 >> 0x24) + cVar32;
  auVar40[5] = (bVar33 >> 4) + bVar33;
  auVar40[6] = (char)(ushort)((ulong)uVar15 >> 0x34) + cVar34;
  auVar40[7] = (bVar35 >> 4) + bVar35;
  auVar40[8] = (char)(ushort)((unkuint10)auVar23._0_10_ >> 0x44) + cVar36;
  auVar40[9] = (bVar37 >> 4) + bVar37;
  auVar40[10] = (char)(auVar23._10_2_ >> 4) + auVar23[10];
  auVar40[0xb] = (auVar23[0xb] >> 4) + auVar23[0xb];
  auVar40[0xc] = (char)(auVar25._12_2_ >> 4) + auVar25[0xc];
  auVar40[0xd] = (auVar25[0xd] >> 4) + auVar25[0xd];
  auVar40[0xe] = (char)(auVar28._14_2_ >> 4) + auVar28[0xe];
  auVar40[0xf] = (auVar28[0xf] >> 4) + auVar28[0xf];
  auVar27 = psadbw((undefined1  [16])0x0,auVar40 & _DAT_002b0070);
  uVar38 = auVar27._8_8_ + auVar27._0_8_;
  uVar17 = uVar38 >> 1 & 0x7fffffff;
  cVar18 = '\x01';
  if (0x13 < uVar38) {
    uVar38 = uVar17;
    cVar30 = '\x04';
    do {
      cVar18 = cVar30;
      if (uVar38 < 100) {
        cVar18 = cVar18 + -2;
        goto LAB_001db780;
      }
      if (uVar38 < 1000) {
        cVar18 = cVar18 + -1;
        goto LAB_001db780;
      }
      if (uVar38 < 10000) goto LAB_001db780;
      bVar3 = 99999 < uVar38;
      uVar38 = uVar38 / 10000;
      cVar30 = cVar18 + '\x04';
    } while (bVar3);
    cVar18 = cVar18 + '\x01';
  }
LAB_001db780:
  local_df8 = &local_de8;
  std::__cxx11::string::_M_construct((ulong)&local_df8,cVar18);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_df8->_M_local_buf,(uint)local_df0,uVar17);
  local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd8,"");
  local_c58 = (ulong *)0x0;
  do {
    if ((((this->clusterVariables).super__Base_bitset<2UL>._M_w[(ulong)local_c58 >> 6] >>
          ((ulong)local_c58 & 0x3f) & 1) != 0) &&
       (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w
         [(ulong)local_c58 >> 6] & 1L << ((byte)local_c58 & 0x3f)) != 0)) {
      pmVar9 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&clusterToVariableMap,(key_type *)&local_c58);
      uVar17 = **(ulong **)
                 &((*(this->varToQuery[*pmVar9]->_aggregates).
                     super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                     super__Vector_impl_data._M_start)->_incoming).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ;
      cVar18 = '\x01';
      if (9 < uVar17) {
        uVar38 = uVar17;
        cVar30 = '\x04';
        do {
          cVar18 = cVar30;
          if (uVar38 < 100) {
            cVar18 = cVar18 + -2;
            goto LAB_001db8ac;
          }
          if (uVar38 < 1000) {
            cVar18 = cVar18 + -1;
            goto LAB_001db8ac;
          }
          if (uVar38 < 10000) goto LAB_001db8ac;
          bVar3 = 99999 < uVar38;
          uVar38 = uVar38 / 10000;
          cVar30 = cVar18 + '\x04';
        } while (bVar3);
        cVar18 = cVar18 + '\x01';
      }
LAB_001db8ac:
      local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_e38,cVar18);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_e38._M_dataplus._M_p,(uint)local_e38._M_string_length,uVar17);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_e38,0,(char *)0x0,0x2a8219)
      ;
      local_db8 = &local_da8;
      plVar6 = puVar8 + 2;
      if ((long *)*puVar8 == plVar6) {
        local_da8 = *plVar6;
        lStack_da0 = puVar8[3];
      }
      else {
        local_da8 = *plVar6;
        local_db8 = (long *)*puVar8;
      }
      local_db0 = puVar8[1];
      *puVar8 = plVar6;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
        operator_delete(local_e38._M_dataplus._M_p);
      }
      pAVar7 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          (size_t)local_c58);
      local_c18 = &local_c08;
      std::__cxx11::string::_M_construct((ulong)&local_c18,'\t');
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_c18);
      local_c38 = &local_c28;
      puVar11 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar11) {
        local_c28 = *puVar11;
        lStack_c20 = puVar8[3];
      }
      else {
        local_c28 = *puVar11;
        local_c38 = (ulong *)*puVar8;
      }
      local_c30 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c38,(ulong)local_db8);
      puVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_cf8.field_2._M_allocated_capacity = *puVar11;
        local_cf8.field_2._8_8_ = puVar8[3];
        local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
      }
      else {
        local_cf8.field_2._M_allocated_capacity = *puVar11;
        local_cf8._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_cf8._M_string_length = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_cf8);
      local_d58 = &local_d48;
      puVar11 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar11) {
        local_d48 = *puVar11;
        uStack_d40 = puVar8[3];
      }
      else {
        local_d48 = *puVar11;
        local_d58 = (ulong *)*puVar8;
      }
      local_d50 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_c98 = &local_c88;
      std::__cxx11::string::_M_construct((ulong)&local_c98,'\f');
      uVar17 = 0xf;
      if (local_d58 != &local_d48) {
        uVar17 = local_d48;
      }
      if (uVar17 < (ulong)(local_c90 + local_d50)) {
        uVar17 = 0xf;
        if (local_c98 != &local_c88) {
          uVar17 = local_c88;
        }
        if (uVar17 < (ulong)(local_c90 + local_d50)) goto LAB_001dbb54;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_c98,0,(char *)0x0,(ulong)local_d58);
      }
      else {
LAB_001dbb54:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d58,(ulong)local_c98);
      }
      local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
      psVar13 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_d38.field_2._M_allocated_capacity = *psVar13;
        local_d38.field_2._8_8_ = puVar8[3];
      }
      else {
        local_d38.field_2._M_allocated_capacity = *psVar13;
        local_d38._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_d38._M_string_length = puVar8[1];
      *puVar8 = psVar13;
      puVar8[1] = 0;
      *(undefined1 *)psVar13 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d38);
      local_d98 = &local_d88;
      puVar11 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar11) {
        local_d88 = *puVar11;
        lStack_d80 = puVar8[3];
      }
      else {
        local_d88 = *puVar11;
        local_d98 = (ulong *)*puVar8;
      }
      local_d90 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_d98,(ulong)(pAVar7->_name)._M_dataplus._M_p);
      local_d78 = &local_d68;
      puVar11 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar11) {
        local_d68 = *puVar11;
        lStack_d60 = puVar8[3];
      }
      else {
        local_d68 = *puVar11;
        local_d78 = (ulong *)*puVar8;
      }
      local_d70 = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d78);
      local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
      puVar11 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_e38.field_2._M_allocated_capacity = *puVar11;
        local_e38.field_2._8_8_ = puVar8[3];
      }
      else {
        local_e38.field_2._M_allocated_capacity = *puVar11;
        local_e38._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_e38._M_string_length = puVar8[1];
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_dd8,(ulong)local_e38._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
        operator_delete(local_e38._M_dataplus._M_p);
      }
      if (local_d78 != &local_d68) {
        operator_delete(local_d78);
      }
      if (local_d98 != &local_d88) {
        operator_delete(local_d98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
        operator_delete(local_d38._M_dataplus._M_p);
      }
      if (local_c98 != &local_c88) {
        operator_delete(local_c98);
      }
      if (local_d58 != &local_d48) {
        operator_delete(local_d58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
        operator_delete(local_cf8._M_dataplus._M_p);
      }
      if (local_c38 != &local_c28) {
        operator_delete(local_c38);
      }
      if (local_c18 != &local_c08) {
        operator_delete(local_c18);
      }
      if (local_db8 != &local_da8) {
        operator_delete(local_db8);
      }
    }
    local_c58 = (ulong *)((long)local_c58 + 1);
  } while (local_c58 < (ulong *)0x64);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x03');
  plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
  local_8b8 = &local_8a8;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_8a8 = *puVar11;
    lStack_8a0 = plVar6[3];
  }
  else {
    local_8a8 = *puVar11;
    local_8b8 = (ulong *)*plVar6;
  }
  local_8b0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_418 = local_408;
  std::__cxx11::string::_M_construct((ulong)&local_418,'\x03');
  uVar17 = 0xf;
  if (local_8b8 != &local_8a8) {
    uVar17 = local_8a8;
  }
  if (uVar17 < (ulong)(local_410 + local_8b0)) {
    uVar17 = 0xf;
    if (local_418 != local_408) {
      uVar17 = local_408[0];
    }
    if (uVar17 < (ulong)(local_410 + local_8b0)) goto LAB_001dbf66;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,(ulong)local_8b8);
  }
  else {
LAB_001dbf66:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8b8,(ulong)local_418);
  }
  local_398 = &local_388;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_388 = *puVar1;
    uStack_380 = puVar8[3];
  }
  else {
    local_388 = *puVar1;
    local_398 = (undefined8 *)*puVar8;
  }
  local_390 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_398);
  local_898 = &local_888;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_888 = *puVar11;
    lStack_880 = plVar6[3];
  }
  else {
    local_888 = *puVar11;
    local_898 = (ulong *)*plVar6;
  }
  local_890 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_438 = local_428;
  std::__cxx11::string::_M_construct((ulong)&local_438,'\x06');
  uVar17 = 0xf;
  if (local_898 != &local_888) {
    uVar17 = local_888;
  }
  if (uVar17 < (ulong)(local_430 + local_890)) {
    uVar17 = 0xf;
    if (local_438 != local_428) {
      uVar17 = local_428[0];
    }
    if (uVar17 < (ulong)(local_430 + local_890)) goto LAB_001dc0cc;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,(ulong)local_898);
  }
  else {
LAB_001dc0cc:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_898,(ulong)local_438);
  }
  local_378 = &local_368;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_368 = *puVar1;
    uStack_360 = puVar8[3];
  }
  else {
    local_368 = *puVar1;
    local_378 = (undefined8 *)*puVar8;
  }
  local_370 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_378);
  local_878 = &local_868;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_868 = *puVar11;
    lStack_860 = plVar6[3];
  }
  else {
    local_868 = *puVar11;
    local_878 = (ulong *)*plVar6;
  }
  local_870 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_458 = local_448;
  std::__cxx11::string::_M_construct((ulong)&local_458,'\x06');
  uVar17 = 0xf;
  if (local_878 != &local_868) {
    uVar17 = local_868;
  }
  if (uVar17 < (ulong)(local_450 + local_870)) {
    uVar17 = 0xf;
    if (local_458 != local_448) {
      uVar17 = local_448[0];
    }
    if (uVar17 < (ulong)(local_450 + local_870)) goto LAB_001dc232;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_458,0,(char *)0x0,(ulong)local_878);
  }
  else {
LAB_001dc232:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_878,(ulong)local_458);
  }
  local_358 = &local_348;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_348 = *puVar1;
    uStack_340 = puVar8[3];
  }
  else {
    local_348 = *puVar1;
    local_358 = (undefined8 *)*puVar8;
  }
  local_350 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_358);
  local_858 = &local_848;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_848 = *puVar11;
    lStack_840 = plVar6[3];
  }
  else {
    local_848 = *puVar11;
    local_858 = (ulong *)*plVar6;
  }
  local_850 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_478 = local_468;
  std::__cxx11::string::_M_construct((ulong)&local_478,'\x06');
  uVar17 = 0xf;
  if (local_858 != &local_848) {
    uVar17 = local_848;
  }
  if (uVar17 < (ulong)(local_470 + local_850)) {
    uVar17 = 0xf;
    if (local_478 != local_468) {
      uVar17 = local_468[0];
    }
    if (uVar17 < (ulong)(local_470 + local_850)) goto LAB_001dc398;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,(ulong)local_858);
  }
  else {
LAB_001dc398:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_858,(ulong)local_478);
  }
  local_338 = &local_328;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_328 = *puVar1;
    uStack_320 = puVar8[3];
  }
  else {
    local_328 = *puVar1;
    local_338 = (undefined8 *)*puVar8;
  }
  local_330 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_338);
  local_d0 = &local_c0;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_c0 = *plVar10;
    lStack_b8 = plVar6[3];
  }
  else {
    local_c0 = *plVar10;
    local_d0 = (long *)*plVar6;
  }
  local_c8 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_c78);
  local_b0 = &local_a0;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_a0 = *plVar10;
    lStack_98 = plVar6[3];
  }
  else {
    local_a0 = *plVar10;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_838 = &local_828;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_828 = *puVar11;
    lStack_820 = plVar6[3];
  }
  else {
    local_828 = *puVar11;
    local_838 = (ulong *)*plVar6;
  }
  local_830 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_498 = local_488;
  std::__cxx11::string::_M_construct((ulong)&local_498,'\x06');
  uVar17 = 0xf;
  if (local_838 != &local_828) {
    uVar17 = local_828;
  }
  if (uVar17 < (ulong)(local_490 + local_830)) {
    uVar17 = 0xf;
    if (local_498 != local_488) {
      uVar17 = local_488[0];
    }
    if (uVar17 < (ulong)(local_490 + local_830)) goto LAB_001dc5cd;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_498,0,(char *)0x0,(ulong)local_838);
  }
  else {
LAB_001dc5cd:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_838,(ulong)local_498);
  }
  local_318 = &local_308;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_308 = *puVar1;
    uStack_300 = puVar8[3];
  }
  else {
    local_308 = *puVar1;
    local_318 = (undefined8 *)*puVar8;
  }
  local_310 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_318);
  local_818 = &local_808;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_808 = *puVar11;
    lStack_800 = plVar6[3];
  }
  else {
    local_808 = *puVar11;
    local_818 = (ulong *)*plVar6;
  }
  local_810 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_4b8 = local_4a8;
  std::__cxx11::string::_M_construct((ulong)&local_4b8,'\x06');
  uVar17 = 0xf;
  if (local_818 != &local_808) {
    uVar17 = local_808;
  }
  if (uVar17 < (ulong)(local_4b0 + local_810)) {
    uVar17 = 0xf;
    if (local_4b8 != local_4a8) {
      uVar17 = local_4a8[0];
    }
    if (uVar17 < (ulong)(local_4b0 + local_810)) goto LAB_001dc733;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4b8,0,(char *)0x0,(ulong)local_818);
  }
  else {
LAB_001dc733:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_818,(ulong)local_4b8);
  }
  local_2f8 = &local_2e8;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_2e8 = *puVar1;
    uStack_2e0 = puVar8[3];
  }
  else {
    local_2e8 = *puVar1;
    local_2f8 = (undefined8 *)*puVar8;
  }
  local_2f0 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  local_7f8 = &local_7e8;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_7e8 = *puVar11;
    lStack_7e0 = plVar6[3];
  }
  else {
    local_7e8 = *puVar11;
    local_7f8 = (ulong *)*plVar6;
  }
  local_7f0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_4d8 = local_4c8;
  std::__cxx11::string::_M_construct((ulong)&local_4d8,'\x06');
  uVar17 = 0xf;
  if (local_7f8 != &local_7e8) {
    uVar17 = local_7e8;
  }
  if (uVar17 < (ulong)(local_4d0 + local_7f0)) {
    uVar17 = 0xf;
    if (local_4d8 != local_4c8) {
      uVar17 = local_4c8[0];
    }
    if (uVar17 < (ulong)(local_4d0 + local_7f0)) goto LAB_001dc899;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4d8,0,(char *)0x0,(ulong)local_7f8);
  }
  else {
LAB_001dc899:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7f8,(ulong)local_4d8);
  }
  local_2d8 = &local_2c8;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_2c8 = *puVar1;
    uStack_2c0 = puVar8[3];
  }
  else {
    local_2c8 = *puVar1;
    local_2d8 = (undefined8 *)*puVar8;
  }
  local_2d0 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  local_7d8 = &local_7c8;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_7c8 = *puVar11;
    lStack_7c0 = plVar6[3];
  }
  else {
    local_7c8 = *puVar11;
    local_7d8 = (ulong *)*plVar6;
  }
  local_7d0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_4f8 = local_4e8;
  std::__cxx11::string::_M_construct((ulong)&local_4f8,'\t');
  uVar17 = 0xf;
  if (local_7d8 != &local_7c8) {
    uVar17 = local_7c8;
  }
  if (uVar17 < (ulong)(local_4f0 + local_7d0)) {
    uVar17 = 0xf;
    if (local_4f8 != local_4e8) {
      uVar17 = local_4e8[0];
    }
    if (uVar17 < (ulong)(local_4f0 + local_7d0)) goto LAB_001dc9ff;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4f8,0,(char *)0x0,(ulong)local_7d8);
  }
  else {
LAB_001dc9ff:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7d8,(ulong)local_4f8);
  }
  local_2b8 = &local_2a8;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_2a8 = *puVar1;
    uStack_2a0 = puVar8[3];
  }
  else {
    local_2a8 = *puVar1;
    local_2b8 = (undefined8 *)*puVar8;
  }
  local_2b0 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_90 = &local_80;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_80 = *plVar10;
    lStack_78 = plVar6[3];
  }
  else {
    local_80 = *plVar10;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)local_dd8._M_dataplus._M_p);
  local_7b8 = &local_7a8;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_7a8 = *puVar11;
    lStack_7a0 = plVar6[3];
  }
  else {
    local_7a8 = *puVar11;
    local_7b8 = (ulong *)*plVar6;
  }
  local_7b0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_518 = local_508;
  std::__cxx11::string::_M_construct((ulong)&local_518,'\x06');
  uVar17 = 0xf;
  if (local_7b8 != &local_7a8) {
    uVar17 = local_7a8;
  }
  if (uVar17 < (ulong)(local_510 + local_7b0)) {
    uVar17 = 0xf;
    if (local_518 != local_508) {
      uVar17 = local_508[0];
    }
    if (uVar17 < (ulong)(local_510 + local_7b0)) goto LAB_001dcbcb;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_518,0,(char *)0x0,(ulong)local_7b8);
  }
  else {
LAB_001dcbcb:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7b8,(ulong)local_518);
  }
  local_298 = &local_288;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_288 = *puVar1;
    uStack_280 = puVar8[3];
  }
  else {
    local_288 = *puVar1;
    local_298 = (undefined8 *)*puVar8;
  }
  local_290 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_798 = &local_788;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_788 = *puVar11;
    lStack_780 = plVar6[3];
  }
  else {
    local_788 = *puVar11;
    local_798 = (ulong *)*plVar6;
  }
  local_790 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_538 = local_528;
  std::__cxx11::string::_M_construct((ulong)&local_538,'\x06');
  uVar17 = 0xf;
  if (local_798 != &local_788) {
    uVar17 = local_788;
  }
  if (uVar17 < (ulong)(local_530 + local_790)) {
    uVar17 = 0xf;
    if (local_538 != local_528) {
      uVar17 = local_528[0];
    }
    if (uVar17 < (ulong)(local_530 + local_790)) goto LAB_001dcd31;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_538,0,(char *)0x0,(ulong)local_798);
  }
  else {
LAB_001dcd31:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_798,(ulong)local_538);
  }
  local_278 = &local_268;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_268 = *puVar1;
    uStack_260 = puVar8[3];
  }
  else {
    local_268 = *puVar1;
    local_278 = (undefined8 *)*puVar8;
  }
  local_270 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_70 = &local_60;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_60 = *plVar10;
    lStack_58 = plVar6[3];
  }
  else {
    local_60 = *plVar10;
    local_70 = (long *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_778 = &local_768;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_768 = *puVar11;
    lStack_760 = plVar6[3];
  }
  else {
    local_768 = *puVar11;
    local_778 = (ulong *)*plVar6;
  }
  local_770 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_558 = local_548;
  std::__cxx11::string::_M_construct((ulong)&local_558,'\x06');
  uVar17 = 0xf;
  if (local_778 != &local_768) {
    uVar17 = local_768;
  }
  if (uVar17 < (ulong)(local_550 + local_770)) {
    uVar17 = 0xf;
    if (local_558 != local_548) {
      uVar17 = local_548[0];
    }
    if (uVar17 < (ulong)(local_550 + local_770)) goto LAB_001dcefa;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,(ulong)local_778);
  }
  else {
LAB_001dcefa:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_778,(ulong)local_558);
  }
  local_258 = &local_248;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_248 = *puVar1;
    uStack_240 = puVar8[3];
  }
  else {
    local_248 = *puVar1;
    local_258 = (undefined8 *)*puVar8;
  }
  local_250 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_758 = &local_748;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_748 = *puVar11;
    lStack_740 = plVar6[3];
  }
  else {
    local_748 = *puVar11;
    local_758 = (ulong *)*plVar6;
  }
  local_750 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_578 = local_568;
  std::__cxx11::string::_M_construct((ulong)&local_578,'\x06');
  uVar17 = 0xf;
  if (local_758 != &local_748) {
    uVar17 = local_748;
  }
  if (uVar17 < (ulong)(local_570 + local_750)) {
    uVar17 = 0xf;
    if (local_578 != local_568) {
      uVar17 = local_568[0];
    }
    if (uVar17 < (ulong)(local_570 + local_750)) goto LAB_001dd060;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_578,0,(char *)0x0,(ulong)local_758);
  }
  else {
LAB_001dd060:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_758,(ulong)local_578);
  }
  local_238 = &local_228;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_228 = *puVar1;
    uStack_220 = puVar8[3];
  }
  else {
    local_228 = *puVar1;
    local_238 = (undefined8 *)*puVar8;
  }
  local_230 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_238);
  local_738 = &local_728;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_728 = *puVar11;
    lStack_720 = plVar6[3];
  }
  else {
    local_728 = *puVar11;
    local_738 = (ulong *)*plVar6;
  }
  local_730 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_598 = local_588;
  std::__cxx11::string::_M_construct((ulong)&local_598,'\t');
  uVar17 = 0xf;
  if (local_738 != &local_728) {
    uVar17 = local_728;
  }
  if (uVar17 < (ulong)(local_590 + local_730)) {
    uVar17 = 0xf;
    if (local_598 != local_588) {
      uVar17 = local_588[0];
    }
    if (uVar17 < (ulong)(local_590 + local_730)) goto LAB_001dd1c6;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_598,0,(char *)0x0,(ulong)local_738);
  }
  else {
LAB_001dd1c6:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_738,(ulong)local_598);
  }
  local_218 = &local_208;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_208 = *puVar1;
    uStack_200 = puVar8[3];
  }
  else {
    local_208 = *puVar1;
    local_218 = (undefined8 *)*puVar8;
  }
  local_210 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_218);
  local_718 = &local_708;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_708 = *puVar11;
    lStack_700 = plVar6[3];
  }
  else {
    local_708 = *puVar11;
    local_718 = (ulong *)*plVar6;
  }
  local_710 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_5b8 = local_5a8;
  std::__cxx11::string::_M_construct((ulong)&local_5b8,'\t');
  uVar17 = 0xf;
  if (local_718 != &local_708) {
    uVar17 = local_708;
  }
  if (uVar17 < (ulong)(local_5b0 + local_710)) {
    uVar17 = 0xf;
    if (local_5b8 != local_5a8) {
      uVar17 = local_5a8[0];
    }
    if (uVar17 < (ulong)(local_5b0 + local_710)) goto LAB_001dd32c;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5b8,0,(char *)0x0,(ulong)local_718);
  }
  else {
LAB_001dd32c:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_718,(ulong)local_5b8);
  }
  local_1f8 = &local_1e8;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_1e8 = *puVar1;
    uStack_1e0 = puVar8[3];
  }
  else {
    local_1e8 = *puVar1;
    local_1f8 = (undefined8 *)*puVar8;
  }
  local_1f0 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_6f8 = &local_6e8;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_6e8 = *puVar11;
    lStack_6e0 = plVar6[3];
  }
  else {
    local_6e8 = *puVar11;
    local_6f8 = (ulong *)*plVar6;
  }
  local_6f0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_5d8 = local_5c8;
  std::__cxx11::string::_M_construct((ulong)&local_5d8,'\t');
  uVar17 = 0xf;
  if (local_6f8 != &local_6e8) {
    uVar17 = local_6e8;
  }
  if (uVar17 < (ulong)(local_5d0 + local_6f0)) {
    uVar17 = 0xf;
    if (local_5d8 != local_5c8) {
      uVar17 = local_5c8[0];
    }
    if (uVar17 < (ulong)(local_5d0 + local_6f0)) goto LAB_001dd492;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5d8,0,(char *)0x0,(ulong)local_6f8);
  }
  else {
LAB_001dd492:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6f8,(ulong)local_5d8);
  }
  local_1d8 = &local_1c8;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_1c8 = *puVar1;
    uStack_1c0 = puVar8[3];
  }
  else {
    local_1c8 = *puVar1;
    local_1d8 = (undefined8 *)*puVar8;
  }
  local_1d0 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  local_6d8 = &local_6c8;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_6c8 = *puVar11;
    lStack_6c0 = plVar6[3];
  }
  else {
    local_6c8 = *puVar11;
    local_6d8 = (ulong *)*plVar6;
  }
  local_6d0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_5f8 = local_5e8;
  std::__cxx11::string::_M_construct((ulong)&local_5f8,'\t');
  uVar17 = 0xf;
  if (local_6d8 != &local_6c8) {
    uVar17 = local_6c8;
  }
  if (uVar17 < (ulong)(local_5f0 + local_6d0)) {
    uVar17 = 0xf;
    if (local_5f8 != local_5e8) {
      uVar17 = local_5e8[0];
    }
    if (uVar17 < (ulong)(local_5f0 + local_6d0)) goto LAB_001dd5f8;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5f8,0,(char *)0x0,(ulong)local_6d8);
  }
  else {
LAB_001dd5f8:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_5f8);
  }
  local_a98 = &local_a88;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_a88 = *puVar11;
    uStack_a80 = puVar8[3];
  }
  else {
    local_a88 = *puVar11;
    local_a98 = (ulong *)*puVar8;
  }
  local_a90 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a98);
  local_a18 = &local_a08;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_a08 = *puVar11;
    lStack_a00 = plVar6[3];
  }
  else {
    local_a08 = *puVar11;
    local_a18 = (ulong *)*plVar6;
  }
  local_a10 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_618 = local_608;
  std::__cxx11::string::_M_construct((ulong)&local_618,'\f');
  uVar17 = 0xf;
  if (local_a18 != &local_a08) {
    uVar17 = local_a08;
  }
  if (uVar17 < (ulong)(local_610 + local_a10)) {
    uVar17 = 0xf;
    if (local_618 != local_608) {
      uVar17 = local_608[0];
    }
    if (uVar17 < (ulong)(local_610 + local_a10)) goto LAB_001dd766;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_618,0,(char *)0x0,(ulong)local_a18);
  }
  else {
LAB_001dd766:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a18,(ulong)local_618);
  }
  local_a78 = &local_a68;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_a68 = *puVar11;
    uStack_a60 = puVar8[3];
  }
  else {
    local_a68 = *puVar11;
    local_a78 = (ulong *)*puVar8;
  }
  local_a70 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a78);
  local_978 = &local_968;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_968 = *puVar11;
    lStack_960 = plVar6[3];
  }
  else {
    local_968 = *puVar11;
    local_978 = (ulong *)*plVar6;
  }
  local_970 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_978,(ulong)local_df8);
  local_958 = &local_948;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_948 = *puVar11;
    lStack_940 = plVar6[3];
  }
  else {
    local_948 = *puVar11;
    local_958 = (ulong *)*plVar6;
  }
  local_950 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_958);
  local_938 = &local_928;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_928 = *puVar11;
    lStack_920 = plVar6[3];
  }
  else {
    local_928 = *puVar11;
    local_938 = (ulong *)*plVar6;
  }
  local_930 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_938,(ulong)local_d18);
  local_918 = &local_908;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_908 = *puVar11;
    lStack_900 = plVar6[3];
  }
  else {
    local_908 = *puVar11;
    local_918 = (ulong *)*plVar6;
  }
  local_910 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_918);
  local_9f8 = &local_9e8;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_9e8 = *puVar11;
    lStack_9e0 = plVar6[3];
  }
  else {
    local_9e8 = *puVar11;
    local_9f8 = (ulong *)*plVar6;
  }
  local_9f0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_638 = local_628;
  std::__cxx11::string::_M_construct((ulong)&local_638,'\f');
  uVar17 = 0xf;
  if (local_9f8 != &local_9e8) {
    uVar17 = local_9e8;
  }
  if (uVar17 < (ulong)(local_630 + local_9f0)) {
    uVar17 = 0xf;
    if (local_638 != local_628) {
      uVar17 = local_628[0];
    }
    if (uVar17 < (ulong)(local_630 + local_9f0)) goto LAB_001dda7c;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_638,0,(char *)0x0,(ulong)local_9f8);
  }
  else {
LAB_001dda7c:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9f8,(ulong)local_638);
  }
  local_a58 = &local_a48;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_a48 = *puVar11;
    uStack_a40 = puVar8[3];
  }
  else {
    local_a48 = *puVar11;
    local_a58 = (ulong *)*puVar8;
  }
  local_a50 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a58);
  local_9d8 = &local_9c8;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_9c8 = *puVar11;
    lStack_9c0 = plVar6[3];
  }
  else {
    local_9c8 = *puVar11;
    local_9d8 = (ulong *)*plVar6;
  }
  local_9d0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_658 = local_648;
  std::__cxx11::string::_M_construct((ulong)&local_658,'\f');
  uVar17 = 0xf;
  if (local_9d8 != &local_9c8) {
    uVar17 = local_9c8;
  }
  if (uVar17 < (ulong)(local_650 + local_9d0)) {
    uVar17 = 0xf;
    if (local_658 != local_648) {
      uVar17 = local_648[0];
    }
    if (uVar17 < (ulong)(local_650 + local_9d0)) goto LAB_001ddbea;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_658,0,(char *)0x0,(ulong)local_9d8);
  }
  else {
LAB_001ddbea:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9d8,(ulong)local_658);
  }
  local_a38 = &local_a28;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_a28 = *puVar11;
    uStack_a20 = puVar8[3];
  }
  else {
    local_a28 = *puVar11;
    local_a38 = (ulong *)*puVar8;
  }
  local_a30 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a38);
  local_e18 = &local_e08;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_e08 = *puVar11;
    lStack_e00 = plVar6[3];
  }
  else {
    local_e08 = *puVar11;
    local_e18 = (ulong *)*plVar6;
  }
  local_e10 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_678 = local_668;
  std::__cxx11::string::_M_construct((ulong)&local_678,'\t');
  uVar17 = 0xf;
  if (local_e18 != &local_e08) {
    uVar17 = local_e08;
  }
  if (uVar17 < (ulong)(local_670 + local_e10)) {
    uVar17 = 0xf;
    if (local_678 != local_668) {
      uVar17 = local_668[0];
    }
    if (uVar17 < (ulong)(local_670 + local_e10)) goto LAB_001ddd3d;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_678,0,(char *)0x0,(ulong)local_e18);
  }
  else {
LAB_001ddd3d:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e18,(ulong)local_678);
  }
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_9a8 = *puVar11;
    uStack_9a0 = puVar8[3];
    local_9b8 = &local_9a8;
  }
  else {
    local_9a8 = *puVar11;
    local_9b8 = (ulong *)*puVar8;
  }
  local_9b0 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_9b8);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_8e8 = *puVar11;
    lStack_8e0 = plVar6[3];
    local_8f8 = &local_8e8;
  }
  else {
    local_8e8 = *puVar11;
    local_8f8 = (ulong *)*plVar6;
  }
  local_8f0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_698 = local_688;
  std::__cxx11::string::_M_construct((ulong)&local_698,'\t');
  uVar17 = 0xf;
  if (local_8f8 != &local_8e8) {
    uVar17 = local_8e8;
  }
  if (uVar17 < (ulong)(local_690 + local_8f0)) {
    uVar17 = 0xf;
    if (local_698 != local_688) {
      uVar17 = local_688[0];
    }
    if (uVar17 < (ulong)(local_690 + local_8f0)) goto LAB_001ddea2;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_698,0,(char *)0x0,(ulong)local_8f8);
  }
  else {
LAB_001ddea2:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8f8,(ulong)local_698);
  }
  plVar6 = puVar8 + 2;
  if ((long *)*puVar8 == plVar6) {
    local_988 = *plVar6;
    lStack_980 = puVar8[3];
    local_998 = &local_988;
  }
  else {
    local_988 = *plVar6;
    local_998 = (long *)*puVar8;
  }
  local_990 = puVar8[1];
  *puVar8 = plVar6;
  puVar8[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_998);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_b28 = *puVar11;
    lStack_b20 = plVar6[3];
    local_b38 = &local_b28;
  }
  else {
    local_b28 = *puVar11;
    local_b38 = (ulong *)*plVar6;
  }
  local_b30 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct((ulong)&local_3b8,'\x06');
  uVar17 = 0xf;
  if (local_b38 != &local_b28) {
    uVar17 = local_b28;
  }
  if (uVar17 < (ulong)(local_3b0 + local_b30)) {
    uVar17 = 0xf;
    if (local_3b8 != local_3a8) {
      uVar17 = local_3a8[0];
    }
    if (uVar17 < (ulong)(local_3b0 + local_b30)) goto LAB_001ddffb;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3b8,0,(char *)0x0,(ulong)local_b38);
  }
  else {
LAB_001ddffb:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b38,(ulong)local_3b8);
  }
  local_b18 = &local_b08;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_b08 = *puVar11;
    uStack_b00 = puVar8[3];
  }
  else {
    local_b08 = *puVar11;
    local_b18 = (ulong *)*puVar8;
  }
  local_b10 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b18);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_af8.field_2._M_allocated_capacity = *puVar11;
    local_af8.field_2._8_8_ = plVar6[3];
    local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
  }
  else {
    local_af8.field_2._M_allocated_capacity = *puVar11;
    local_af8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_af8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct((ulong)&local_3d8,'\x06');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    uVar15 = local_af8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_3d0 + local_af8._M_string_length) {
    uVar17 = 0xf;
    if (local_3d8 != local_3c8) {
      uVar17 = local_3c8[0];
    }
    if (uVar17 < local_3d0 + local_af8._M_string_length) goto LAB_001de15a;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_3d8,0,(char *)0x0,(ulong)local_af8._M_dataplus._M_p);
  }
  else {
LAB_001de15a:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_af8,(ulong)local_3d8);
  }
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_bc8 = *puVar1;
    uStack_bc0 = puVar8[3];
    local_bd8 = &local_bc8;
  }
  else {
    local_bc8 = *puVar1;
    local_bd8 = (undefined8 *)*puVar8;
  }
  local_bd0 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_bd8);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_aa8 = *puVar11;
    lStack_aa0 = plVar6[3];
    local_ab8 = &local_aa8;
  }
  else {
    local_aa8 = *puVar11;
    local_ab8 = (ulong *)*plVar6;
  }
  local_ab0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_ab8);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_be8 = *puVar11;
    lStack_be0 = plVar6[3];
    local_bf8 = &local_be8;
  }
  else {
    local_be8 = *puVar11;
    local_bf8 = (ulong *)*plVar6;
  }
  local_bf0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_6b8 = local_6a8;
  std::__cxx11::string::_M_construct((ulong)&local_6b8,'\x06');
  uVar17 = 0xf;
  if (local_bf8 != &local_be8) {
    uVar17 = local_be8;
  }
  if (uVar17 < (ulong)(local_6b0 + local_bf0)) {
    uVar17 = 0xf;
    if (local_6b8 != local_6a8) {
      uVar17 = local_6a8[0];
    }
    if (uVar17 < (ulong)(local_6b0 + local_bf0)) goto LAB_001de32b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_6b8,0,(char *)0x0,(ulong)local_bf8);
  }
  else {
LAB_001de32b:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bf8,(ulong)local_6b8);
  }
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_b68 = *puVar11;
    uStack_b60 = puVar8[3];
    local_b78 = &local_b68;
  }
  else {
    local_b68 = *puVar11;
    local_b78 = (ulong *)*puVar8;
  }
  local_b70 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b78);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_ac8 = *puVar11;
    lStack_ac0 = plVar6[3];
    local_ad8 = &local_ac8;
  }
  else {
    local_ac8 = *puVar11;
    local_ad8 = (ulong *)*plVar6;
  }
  local_ad0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_3f8 = local_3e8;
  std::__cxx11::string::_M_construct((ulong)&local_3f8,'\x06');
  uVar17 = 0xf;
  if (local_ad8 != &local_ac8) {
    uVar17 = local_ac8;
  }
  if (uVar17 < (ulong)(local_3f0 + local_ad0)) {
    uVar17 = 0xf;
    if (local_3f8 != local_3e8) {
      uVar17 = local_3e8[0];
    }
    if (uVar17 < (ulong)(local_3f0 + local_ad0)) goto LAB_001de483;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3f8,0,(char *)0x0,(ulong)local_ad8);
  }
  else {
LAB_001de483:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ad8,(ulong)local_3f8);
  }
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_b48 = *puVar11;
    lStack_b40 = puVar8[3];
    local_b58 = &local_b48;
  }
  else {
    local_b48 = *puVar11;
    local_b58 = (ulong *)*puVar8;
  }
  local_b50 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b58);
  local_b98 = &local_b88;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_b88 = *puVar11;
    lStack_b80 = plVar6[3];
  }
  else {
    local_b88 = *puVar11;
    local_b98 = (ulong *)*plVar6;
  }
  local_b90 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x06');
  uVar17 = 0xf;
  if (local_b98 != &local_b88) {
    uVar17 = local_b88;
  }
  if (uVar17 < (ulong)(local_f0 + local_b90)) {
    uVar17 = 0xf;
    if (local_f8 != local_e8) {
      uVar17 = local_e8[0];
    }
    if (uVar17 < (ulong)(local_f0 + local_b90)) goto LAB_001de5e2;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_b98);
  }
  else {
LAB_001de5e2:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b98,(ulong)local_f8);
  }
  local_bb8 = &local_ba8;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_ba8 = *puVar11;
    lStack_ba0 = puVar8[3];
  }
  else {
    local_ba8 = *puVar11;
    local_bb8 = (ulong *)*puVar8;
  }
  local_bb0 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_bb8);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_c48 = *puVar11;
    lStack_c40 = plVar6[3];
    local_c58 = &local_c48;
  }
  else {
    local_c48 = *puVar11;
    local_c58 = (ulong *)*plVar6;
  }
  local_c50 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x06');
  uVar17 = 0xf;
  if (local_c58 != &local_c48) {
    uVar17 = local_c48;
  }
  if (uVar17 < (ulong)(local_110 + local_c50)) {
    uVar17 = 0xf;
    if (local_118 != local_108) {
      uVar17 = local_108[0];
    }
    if (uVar17 < (ulong)(local_110 + local_c50)) goto LAB_001de742;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_c58);
  }
  else {
LAB_001de742:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c58,(ulong)local_118);
  }
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_c88 = *puVar11;
    uStack_c80 = puVar8[3];
    local_c98 = &local_c88;
  }
  else {
    local_c88 = *puVar11;
    local_c98 = (ulong *)*puVar8;
  }
  local_c90 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c98);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_c08 = *puVar11;
    lStack_c00 = plVar6[3];
    local_c18 = &local_c08;
  }
  else {
    local_c08 = *puVar11;
    local_c18 = (ulong *)*plVar6;
  }
  local_c10 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\x06');
  uVar17 = 0xf;
  if (local_c18 != &local_c08) {
    uVar17 = local_c08;
  }
  if (uVar17 < (ulong)(local_130 + local_c10)) {
    uVar17 = 0xf;
    if (local_138 != local_128) {
      uVar17 = local_128[0];
    }
    if (uVar17 < (ulong)(local_130 + local_c10)) goto LAB_001de899;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_c18);
  }
  else {
LAB_001de899:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c18,(ulong)local_138);
  }
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_c28 = *puVar11;
    lStack_c20 = puVar8[3];
    local_c38 = &local_c28;
  }
  else {
    local_c28 = *puVar11;
    local_c38 = (ulong *)*puVar8;
  }
  local_c30 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c38);
  local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_cf8.field_2._M_allocated_capacity = *puVar11;
    local_cf8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_cf8.field_2._M_allocated_capacity = *puVar11;
    local_cf8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_cf8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_158 = local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\t');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    uVar15 = local_cf8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_150 + local_cf8._M_string_length) {
    uVar17 = 0xf;
    if (local_158 != local_148) {
      uVar17 = local_148[0];
    }
    if (uVar17 < local_150 + local_cf8._M_string_length) goto LAB_001dea00;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_158,0,(char *)0x0,(ulong)local_cf8._M_dataplus._M_p);
  }
  else {
LAB_001dea00:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_cf8,(ulong)local_158);
  }
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_d48 = *puVar11;
    uStack_d40 = puVar8[3];
    local_d58 = &local_d48;
  }
  else {
    local_d48 = *puVar11;
    local_d58 = (ulong *)*puVar8;
  }
  local_d50 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d58);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_d38.field_2._M_allocated_capacity = *puVar11;
    local_d38.field_2._8_8_ = plVar6[3];
    local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
  }
  else {
    local_d38.field_2._M_allocated_capacity = *puVar11;
    local_d38._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_d38._M_string_length = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_178 = local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,'\x06');
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    uVar15 = local_d38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_170 + local_d38._M_string_length) {
    uVar17 = 0xf;
    if (local_178 != local_168) {
      uVar17 = local_168[0];
    }
    if (uVar17 < local_170 + local_d38._M_string_length) goto LAB_001deb5a;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_178,0,(char *)0x0,(ulong)local_d38._M_dataplus._M_p);
  }
  else {
LAB_001deb5a:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d38,(ulong)local_178);
  }
  local_d98 = &local_d88;
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    local_d88 = *puVar11;
    lStack_d80 = puVar8[3];
  }
  else {
    local_d88 = *puVar11;
    local_d98 = (ulong *)*puVar8;
  }
  local_d90 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d98);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_d68 = *puVar11;
    lStack_d60 = plVar6[3];
    local_d78 = &local_d68;
  }
  else {
    local_d68 = *puVar11;
    local_d78 = (ulong *)*plVar6;
  }
  local_d70 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_198 = local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,'\x03');
  uVar17 = 0xf;
  if (local_d78 != &local_d68) {
    uVar17 = local_d68;
  }
  if (uVar17 < (ulong)(local_190 + local_d70)) {
    uVar17 = 0xf;
    if (local_198 != local_188) {
      uVar17 = local_188[0];
    }
    if ((ulong)(local_190 + local_d70) <= uVar17) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_d78);
      goto LAB_001dece1;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d78,(ulong)local_198);
LAB_001dece1:
  local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
  psVar13 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_e38.field_2._M_allocated_capacity = *psVar13;
    local_e38.field_2._8_8_ = puVar8[3];
  }
  else {
    local_e38.field_2._M_allocated_capacity = *psVar13;
    local_e38._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_e38._M_string_length = puVar8[1];
  *puVar8 = psVar13;
  puVar8[1] = 0;
  *(undefined1 *)psVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_e38);
  local_db8 = &local_da8;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_da8 = *plVar10;
    lStack_da0 = plVar6[3];
  }
  else {
    local_da8 = *plVar10;
    local_db8 = (long *)*plVar6;
  }
  local_db0 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_d78 != &local_d68) {
    operator_delete(local_d78);
  }
  if (local_d98 != &local_d88) {
    operator_delete(local_d98);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p);
  }
  if (local_d58 != &local_d48) {
    operator_delete(local_d58);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    operator_delete(local_cf8._M_dataplus._M_p);
  }
  if (local_c38 != &local_c28) {
    operator_delete(local_c38);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if (local_c18 != &local_c08) {
    operator_delete(local_c18);
  }
  if (local_c98 != &local_c88) {
    operator_delete(local_c98);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  psVar5 = local_d8;
  if (local_c58 != &local_c48) {
    operator_delete(local_c58);
  }
  if (local_bb8 != &local_ba8) {
    operator_delete(local_bb8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_b98 != &local_b88) {
    operator_delete(local_b98);
  }
  if (local_b58 != &local_b48) {
    operator_delete(local_b58);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_ad8 != &local_ac8) {
    operator_delete(local_ad8);
  }
  if (local_b78 != &local_b68) {
    operator_delete(local_b78);
  }
  if (local_6b8 != local_6a8) {
    operator_delete(local_6b8);
  }
  if (local_bf8 != &local_be8) {
    operator_delete(local_bf8);
  }
  if (local_ab8 != &local_aa8) {
    operator_delete(local_ab8);
  }
  if (local_bd8 != &local_bc8) {
    operator_delete(local_bd8);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    operator_delete(local_af8._M_dataplus._M_p);
  }
  if (local_b18 != &local_b08) {
    operator_delete(local_b18);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  if (local_b38 != &local_b28) {
    operator_delete(local_b38);
  }
  if (local_998 != &local_988) {
    operator_delete(local_998);
  }
  if (local_698 != local_688) {
    operator_delete(local_698);
  }
  if (local_8f8 != &local_8e8) {
    operator_delete(local_8f8);
  }
  if (local_9b8 != &local_9a8) {
    operator_delete(local_9b8);
  }
  if (local_678 != local_668) {
    operator_delete(local_678);
  }
  if (local_e18 != &local_e08) {
    operator_delete(local_e18);
  }
  if (local_a38 != &local_a28) {
    operator_delete(local_a38);
  }
  if (local_658 != local_648) {
    operator_delete(local_658);
  }
  if (local_9d8 != &local_9c8) {
    operator_delete(local_9d8);
  }
  if (local_a58 != &local_a48) {
    operator_delete(local_a58);
  }
  if (local_638 != local_628) {
    operator_delete(local_638);
  }
  if (local_9f8 != &local_9e8) {
    operator_delete(local_9f8);
  }
  if (local_918 != &local_908) {
    operator_delete(local_918);
  }
  if (local_938 != &local_928) {
    operator_delete(local_938);
  }
  if (local_958 != &local_948) {
    operator_delete(local_958);
  }
  if (local_978 != &local_968) {
    operator_delete(local_978);
  }
  if (local_a78 != &local_a68) {
    operator_delete(local_a78);
  }
  if (local_618 != local_608) {
    operator_delete(local_618);
  }
  if (local_a18 != &local_a08) {
    operator_delete(local_a18);
  }
  if (local_a98 != &local_a88) {
    operator_delete(local_a98);
  }
  if (local_5f8 != local_5e8) {
    operator_delete(local_5f8);
  }
  if (local_6d8 != &local_6c8) {
    operator_delete(local_6d8);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_5d8 != local_5c8) {
    operator_delete(local_5d8);
  }
  if (local_6f8 != &local_6e8) {
    operator_delete(local_6f8);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8);
  }
  if (local_718 != &local_708) {
    operator_delete(local_718);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_598 != local_588) {
    operator_delete(local_598);
  }
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_578 != local_568) {
    operator_delete(local_578);
  }
  if (local_758 != &local_748) {
    operator_delete(local_758);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_558 != local_548) {
    operator_delete(local_558);
  }
  if (local_778 != &local_768) {
    operator_delete(local_778);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278);
  }
  if (local_538 != local_528) {
    operator_delete(local_538);
  }
  if (local_798 != &local_788) {
    operator_delete(local_798);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298);
  }
  if (local_518 != local_508) {
    operator_delete(local_518);
  }
  if (local_7b8 != &local_7a8) {
    operator_delete(local_7b8);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8);
  }
  if (local_7d8 != &local_7c8) {
    operator_delete(local_7d8);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8);
  }
  if (local_7f8 != &local_7e8) {
    operator_delete(local_7f8);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8);
  }
  if (local_818 != &local_808) {
    operator_delete(local_818);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if (local_498 != local_488) {
    operator_delete(local_498);
  }
  if (local_838 != &local_828) {
    operator_delete(local_838);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  if (local_478 != local_468) {
    operator_delete(local_478);
  }
  if (local_858 != &local_848) {
    operator_delete(local_858);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358);
  }
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  if (local_878 != &local_868) {
    operator_delete(local_878);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  if (local_898 != &local_888) {
    operator_delete(local_898);
  }
  if (local_398 != &local_388) {
    operator_delete(local_398);
  }
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  if (local_8b8 != &local_8a8) {
    operator_delete(local_8b8);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::operator+(&local_e38,&local_cd8,&local_cb8);
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_e38,(ulong)local_db8);
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  psVar13 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar13) {
    lVar4 = plVar6[3];
    (psVar5->field_2)._M_allocated_capacity = *psVar13;
    *(long *)((long)&psVar5->field_2 + 8) = lVar4;
  }
  else {
    (psVar5->_M_dataplus)._M_p = (pointer)*plVar6;
    (psVar5->field_2)._M_allocated_capacity = *psVar13;
  }
  psVar5->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p);
  }
  if (local_db8 != &local_da8) {
    operator_delete(local_db8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
    operator_delete(local_dd8._M_dataplus._M_p);
  }
  if (local_df8 != &local_de8) {
    operator_delete(local_df8);
  }
  if (local_c78 != &local_c68) {
    operator_delete(local_c78);
  }
  if (local_d18 != &local_d08) {
    operator_delete(local_d18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
    operator_delete(local_cb8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p);
  }
  if (local_8d8 != &local_8c8) {
    operator_delete(local_8d8);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  return psVar5;
}

Assistant:

std::string KMeans::genModelEvaluationFunction()
{
    std::string attributeString = "",
        attrConstruct = offset(4)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
    
    for (size_t var = 0; var < numberOfOriginalVariables; ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(5)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(2)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(5)+"\'|\');\n";

    std::string testTuple = offset(1)+"struct Test_tuple\n"+offset(1)+"{\n"+
        attributeString+offset(2)+"Test_tuple(const std::string& tuple)\n"+
        offset(2)+"{\n"+attrConstruct+offset(2)+"}\n"+offset(1)+"};\n\n";

    std::string loadFunction = offset(1)+"void loadTestDataset("+
        "std::vector<Test_tuple>& TestDataset)\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n"+
        offset(2)+"input.open(PATH_TO_DATA + \"/joinresult.tbl\");\n"+
        offset(2)+"if (!input)\n"+offset(2)+"{\n"+
        offset(3)+"std::cerr << \"joinresult.tbl does is not exist.\\n\";\n"+
        offset(3)+"exit(1);\n"+offset(2)+"}\n"+
        offset(2)+"while(getline(input, line))\n"+
        offset(3)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(2)+"input.close();\n"+offset(1)+"}\n\n";

    size_t categVarIdx = 0;
    std::string distance = "", valueToMeanMap = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        std::string& varName = att->_name;
        
        if (_isCategoricalFeature[var])
        {
            const std::string& viewName = "V"+std::to_string(
                varToQuery[var]->_aggregates[0]->_incoming[0].first);
            
            distance += "-2*means[cluster].cluster_"+varName+"["+
                varName+"_clusterIndex[tuple."+varName+"]]";

            valueToMeanMap += "\n"+offset(2)+"std::unordered_map<"+
                typeToStr(att->_type)+", size_t> "+
                varName+"_clusterIndex("+viewName+".size());\n"+
                offset(2)+"for (size_t l=0; l<"+viewName+".size(); ++l)\n"+
                offset(3)+varName+"_clusterIndex["+viewName+"[l]."+varName+"] = l;\n";

            ++categVarIdx;
        }
        else
            distance += "+((tuple."+att->_name+"-means[cluster].cluster_"+att->_name+")"+
                "*(tuple."+att->_name+"-means[cluster].cluster_"+att->_name+"))";
    }
    
    std::string numCategVar = std::to_string(_isCategoricalFeature.count()/2); 

    std::string precompMeanSum = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!clusterVariables[var] || !_isCategoricalFeature[var])
            continue;

        size_t origVar = clusterToVariableMap[var];
        const std::string& origView = "V"+std::to_string(
            varToQuery[origVar]->_aggregates[0]->_incoming[0].first);

        const std::string& attName = _td->getAttribute(var)->_name;

        // precompMeanSum += offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        //     Offset(2)+"{\N"+offset(3)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
        //     offset(4)+"sum_mean_squared[idx] += std::pow(means[cluster]."
        //     +attName+"[i],2);\n"+offset(3)+"++idx;\n"+offset(2)+"}\n\n";
        
        precompMeanSum += offset(3)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
            offset(4)+"sum_mean_squared[cluster] += std::pow(mean_tuple."
            +attName+"[i],2);\n\n";
    }
    
    std::string evalFunction = offset(1)+"void evaluateModel(Cluster_mean* means)\n"+
        offset(1)+"{\n"+
        offset(2)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(2)+"loadTestDataset(TestDataset);\n"+
        offset(2)+"size_t idx = 0;\n"+valueToMeanMap+"\n"+
        offset(2)+"double sum_mean_squared[k] = {};\n"+
        offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(2)+"{\n"+offset(3)+"Cluster_mean& mean_tuple = means[cluster];\n"+
        precompMeanSum+offset(2)+"}\n"+
        offset(2)+"double distance, error = 0.0, "+
        "min_distance;\n"+
        offset(2)+"std::vector<size_t> assignments(TestDataset.size());\n"+
        // offset(2)+"#pragma omp parallel for num_threads(32) private(min_distance,distance) reduction(+:error)\n"+
        offset(2)+"for (size_t tup = 0; tup < TestDataset.size(); ++tup){\n"+
        offset(3)+"const Test_tuple &tuple = TestDataset[tup];\n"+
        // offset(2)+"for (Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(3)+"min_distance = std::numeric_limits<double>::max();\n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(3)+"{\n"+
        offset(4)+"distance = "+numCategVar+"+sum_mean_squared[cluster]"+distance+";\n"+
        offset(4)+"if(distance < min_distance) assignments[tup] = cluster;\n"+
        offset(4)+"min_distance = std::min(distance, min_distance);\n"+
        offset(3)+"}\n"+offset(3)+"error += min_distance;\n"+
        offset(2)+"}\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << error;\n"+
        offset(2)+"ofs.close();\n\n"+
        offset(2)+
        "std::cout << \"Within Cluster l2-distance: \" << error << std::endl;\n"+
        offset(2)+"ofs.open(\"assignments.csv\");\n"+
        offset(2)+"for (const size_t& a : assignments)\n"+
        offset(3)+"ofs << a << \"\\n\";\n"+
        offset(2)+"ofs.close();\n"+
        offset(1)+"}\n";

    return testTuple + loadFunction + evalFunction;
}